

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx2::forward
          (Convolution1D_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int *piVar30;
  void *pvVar31;
  int iVar32;
  uint _h;
  int iVar33;
  long lVar34;
  uint uVar35;
  undefined4 *puVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  float *pfVar40;
  uint *puVar41;
  undefined4 *puVar42;
  ulong uVar43;
  uint *puVar44;
  undefined1 (*pauVar45) [16];
  float *pfVar46;
  undefined1 (*pauVar47) [32];
  ulong uVar48;
  undefined1 (*pauVar49) [32];
  float *pfVar50;
  uint *puVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  undefined1 (*pauVar55) [32];
  undefined1 (*pauVar56) [16];
  long lVar57;
  bool bVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [28];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar217;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar356;
  float fVar357;
  float fVar359;
  float fVar360;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar358;
  float fVar361;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [64];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [64];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [64];
  undefined1 auVar460 [64];
  Mat bottom_blob_bordered;
  ulong local_148;
  Mat local_b8;
  long local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  uVar48 = bottom_blob->elemsize;
  uVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx2[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar54 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elempack = 0;
  local_b8.h = 0;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.d = (int)local_b8.refcount;
  local_b8.c = local_b8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_avx2 +
             (long)this->_vptr_Convolution1D_x86_avx2[-3]),bottom_blob,&local_b8,opt);
  iVar32 = local_b8.h;
  iVar52 = -100;
  if (((Allocator *)local_b8.data != (Allocator *)0x0) && ((long)local_b8.c * local_b8.cstep != 0))
  {
    lVar34 = 1;
    if (opt->use_packing_layout == true) {
      lVar34 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]) & 7) != 0) {
        lVar34 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]
                                   ) & 3) == 0) * 3 + 1;
      }
    }
    uVar53 = (ulong)(uint)local_b8.h;
    uVar38 = (uint)lVar34;
    iVar3 = (local_b8.w + ~((iVar3 + -1) * iVar54)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx2[-3]);
    local_50 = (ulong)(iVar3 + 1U);
    _h = *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]) / (int)uVar38;
    Mat::create(top_blob,iVar3 + 1U,_h,lVar34 * (uVar48 / (ulong)(long)(int)uVar2),uVar38,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar37 = uVar2 ^ 8;
      uVar35 = uVar38 ^ 8;
      if ((uVar35 == 0 && uVar37 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_148 = 0;
        auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar385 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar306._8_4_ = 0x3f800000;
        auVar306._0_8_ = 0x3f8000003f800000;
        auVar306._12_4_ = 0x3f800000;
        auVar306._16_4_ = 0x3f800000;
        auVar306._20_4_ = 0x3f800000;
        auVar306._24_4_ = 0x3f800000;
        auVar306._28_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar47 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_148 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar54 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar175 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_148 * 0x20));
              }
              if (iVar32 < 1) {
                auVar424 = ZEXT3264(auVar175._0_32_);
              }
              else {
                pauVar55 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_148 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                puVar42 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar52) * 4 + 4);
                uVar48 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                    auVar424 = ZEXT3264(auVar175._0_32_);
                  }
                  else {
                    puVar36 = puVar42;
                    iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      uVar1 = puVar36[-7];
                      auVar406._4_4_ = uVar1;
                      auVar406._0_4_ = uVar1;
                      auVar406._8_4_ = uVar1;
                      auVar406._12_4_ = uVar1;
                      auVar406._16_4_ = uVar1;
                      auVar406._20_4_ = uVar1;
                      auVar406._24_4_ = uVar1;
                      auVar406._28_4_ = uVar1;
                      uVar1 = puVar36[-6];
                      auVar301._4_4_ = uVar1;
                      auVar301._0_4_ = uVar1;
                      auVar301._8_4_ = uVar1;
                      auVar301._12_4_ = uVar1;
                      auVar301._16_4_ = uVar1;
                      auVar301._20_4_ = uVar1;
                      auVar301._24_4_ = uVar1;
                      auVar301._28_4_ = uVar1;
                      uVar1 = puVar36[-5];
                      auVar332._4_4_ = uVar1;
                      auVar332._0_4_ = uVar1;
                      auVar332._8_4_ = uVar1;
                      auVar332._12_4_ = uVar1;
                      auVar332._16_4_ = uVar1;
                      auVar332._20_4_ = uVar1;
                      auVar332._24_4_ = uVar1;
                      auVar332._28_4_ = uVar1;
                      uVar1 = puVar36[-4];
                      auVar300._4_4_ = uVar1;
                      auVar300._0_4_ = uVar1;
                      auVar300._8_4_ = uVar1;
                      auVar300._12_4_ = uVar1;
                      auVar300._16_4_ = uVar1;
                      auVar300._20_4_ = uVar1;
                      auVar300._24_4_ = uVar1;
                      auVar300._28_4_ = uVar1;
                      uVar1 = puVar36[-3];
                      auVar331._4_4_ = uVar1;
                      auVar331._0_4_ = uVar1;
                      auVar331._8_4_ = uVar1;
                      auVar331._12_4_ = uVar1;
                      auVar331._16_4_ = uVar1;
                      auVar331._20_4_ = uVar1;
                      auVar331._24_4_ = uVar1;
                      auVar331._28_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar443._4_4_ = uVar1;
                      auVar443._0_4_ = uVar1;
                      auVar443._8_4_ = uVar1;
                      auVar443._12_4_ = uVar1;
                      auVar443._16_4_ = uVar1;
                      auVar443._20_4_ = uVar1;
                      auVar443._24_4_ = uVar1;
                      auVar443._28_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar350._4_4_ = uVar1;
                      auVar350._0_4_ = uVar1;
                      auVar350._8_4_ = uVar1;
                      auVar350._12_4_ = uVar1;
                      auVar350._16_4_ = uVar1;
                      auVar350._20_4_ = uVar1;
                      auVar350._24_4_ = uVar1;
                      auVar350._28_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar368._4_4_ = uVar1;
                      auVar368._0_4_ = uVar1;
                      auVar368._8_4_ = uVar1;
                      auVar368._12_4_ = uVar1;
                      auVar368._16_4_ = uVar1;
                      auVar368._20_4_ = uVar1;
                      auVar368._24_4_ = uVar1;
                      auVar368._28_4_ = uVar1;
                      auVar321 = vfmadd132ps_fma(auVar406,auVar175._0_32_,*pauVar55);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar301,pauVar55[1]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar332,pauVar55[2]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar300,pauVar55[3]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar331,pauVar55[4]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar443,pauVar55[5]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar350,pauVar55[6]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar368,pauVar55[7]);
                      auVar424 = ZEXT1664(auVar321);
                      pauVar55 = pauVar55 + 8;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      auVar175 = ZEXT1664(auVar321);
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar48 = uVar48 + 1;
                  puVar42 = (undefined4 *)((long)puVar42 + (long)local_b8.w * local_b8.elemsize);
                  auVar175 = ZEXT3264(auVar424._0_32_);
                } while (uVar48 != uVar53);
              }
              auVar301 = auVar424._0_32_;
              p_Var4 = pp_Var5[-3];
              auVar332 = auVar377._0_32_;
              auVar300 = auVar385._0_32_;
              auVar175._28_36_ = auVar424._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar301 = vmaxps_avx(auVar301,auVar332);
                break;
              case 2:
                auVar300 = vmaxps_avx(auVar301,auVar332);
                auVar301 = vminps_avx(auVar301,auVar332);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar407._4_4_ = uVar1;
                auVar407._0_4_ = uVar1;
                auVar407._8_4_ = uVar1;
                auVar407._12_4_ = uVar1;
                auVar407._16_4_ = uVar1;
                auVar407._20_4_ = uVar1;
                auVar407._24_4_ = uVar1;
                auVar407._28_4_ = uVar1;
                auVar321 = vfmadd213ps_fma(auVar407,auVar301,auVar300);
                auVar301 = ZEXT1632(auVar321);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar158._4_4_ = uVar1;
                auVar158._0_4_ = uVar1;
                auVar158._8_4_ = uVar1;
                auVar158._12_4_ = uVar1;
                auVar158._16_4_ = uVar1;
                auVar158._20_4_ = uVar1;
                auVar158._24_4_ = uVar1;
                auVar158._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar303._4_4_ = uVar1;
                auVar303._0_4_ = uVar1;
                auVar303._8_4_ = uVar1;
                auVar303._12_4_ = uVar1;
                auVar303._16_4_ = uVar1;
                auVar303._20_4_ = uVar1;
                auVar303._24_4_ = uVar1;
                auVar303._28_4_ = uVar1;
                auVar301 = vmaxps_avx(auVar301,auVar158);
                auVar301 = vminps_avx(auVar301,auVar303);
                break;
              case 4:
                auVar159._0_8_ = auVar424._0_8_ ^ 0x8000000080000000;
                auVar159._8_4_ = -auVar424._8_4_;
                auVar159._12_4_ = -auVar424._12_4_;
                auVar159._16_4_ = -auVar424._16_4_;
                auVar159._20_4_ = -auVar424._20_4_;
                auVar159._24_4_ = -auVar424._24_4_;
                auVar159._28_4_ = auVar424._28_4_ ^ 0x80000000;
                auVar236._8_4_ = 0x42b0c0a5;
                auVar236._0_8_ = 0x42b0c0a542b0c0a5;
                auVar236._12_4_ = 0x42b0c0a5;
                auVar236._16_4_ = 0x42b0c0a5;
                auVar236._20_4_ = 0x42b0c0a5;
                auVar236._24_4_ = 0x42b0c0a5;
                auVar236._28_4_ = 0x42b0c0a5;
                auVar301 = vminps_avx(auVar159,auVar236);
                auVar237._8_4_ = 0xc2b0c0a5;
                auVar237._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar237._12_4_ = 0xc2b0c0a5;
                auVar237._16_4_ = 0xc2b0c0a5;
                auVar237._20_4_ = 0xc2b0c0a5;
                auVar237._24_4_ = 0xc2b0c0a5;
                auVar237._28_4_ = 0xc2b0c0a5;
                auVar332 = vmaxps_avx(auVar301,auVar237);
                auVar304._8_4_ = 0x3fb8aa3b;
                auVar304._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar304._12_4_ = 0x3fb8aa3b;
                auVar304._16_4_ = 0x3fb8aa3b;
                auVar304._20_4_ = 0x3fb8aa3b;
                auVar304._24_4_ = 0x3fb8aa3b;
                auVar304._28_4_ = 0x3fb8aa3b;
                auVar321 = vfmadd213ps_fma(auVar304,auVar332,auVar300);
                auVar331 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar301 = vcmpps_avx(ZEXT1632(auVar321),auVar331,1);
                auVar301 = vandps_avx(auVar301,auVar306);
                auVar301 = vsubps_avx(auVar331,auVar301);
                auVar238._8_4_ = 0xbf317218;
                auVar238._0_8_ = 0xbf317218bf317218;
                auVar238._12_4_ = 0xbf317218;
                auVar238._16_4_ = 0xbf317218;
                auVar238._20_4_ = 0xbf317218;
                auVar238._24_4_ = 0xbf317218;
                auVar238._28_4_ = 0xbf317218;
                auVar316 = vfmadd231ps_fma(auVar332,auVar301,auVar238);
                auVar332 = ZEXT1632(auVar316);
                fVar59 = auVar316._0_4_;
                fVar356 = auVar316._4_4_;
                fVar357 = auVar316._8_4_;
                fVar358 = auVar316._12_4_;
                auVar19._28_4_ = auVar331._28_4_;
                auVar19._0_28_ =
                     ZEXT1628(CONCAT412(fVar358 * fVar358,
                                        CONCAT48(fVar357 * fVar357,
                                                 CONCAT44(fVar356 * fVar356,fVar59 * fVar59))));
                auVar334._8_4_ = 0x39506967;
                auVar334._0_8_ = 0x3950696739506967;
                auVar334._12_4_ = 0x39506967;
                auVar334._16_4_ = 0x39506967;
                auVar334._20_4_ = 0x39506967;
                auVar334._24_4_ = 0x39506967;
                auVar334._28_4_ = 0x39506967;
                auVar239._8_4_ = 0x3ab743ce;
                auVar239._0_8_ = 0x3ab743ce3ab743ce;
                auVar239._12_4_ = 0x3ab743ce;
                auVar239._16_4_ = 0x3ab743ce;
                auVar239._20_4_ = 0x3ab743ce;
                auVar239._24_4_ = 0x3ab743ce;
                auVar239._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar334,auVar332,auVar239);
                auVar208._8_4_ = 0x3c088908;
                auVar208._0_8_ = 0x3c0889083c088908;
                auVar208._12_4_ = 0x3c088908;
                auVar208._16_4_ = 0x3c088908;
                auVar208._20_4_ = 0x3c088908;
                auVar208._24_4_ = 0x3c088908;
                auVar208._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar208);
                auVar112._8_4_ = 0x3d2aa9c1;
                auVar112._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar112._12_4_ = 0x3d2aa9c1;
                auVar112._16_4_ = 0x3d2aa9c1;
                auVar112._20_4_ = 0x3d2aa9c1;
                auVar112._24_4_ = 0x3d2aa9c1;
                auVar112._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar112);
                auVar113._8_4_ = 0x3e2aaaaa;
                auVar113._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar113._12_4_ = 0x3e2aaaaa;
                auVar113._16_4_ = 0x3e2aaaaa;
                auVar113._20_4_ = 0x3e2aaaaa;
                auVar113._24_4_ = 0x3e2aaaaa;
                auVar113._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar113);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar300);
                auVar160._0_4_ = fVar59 + 1.0;
                auVar160._4_4_ = fVar356 + 1.0;
                auVar160._8_4_ = fVar357 + 1.0;
                auVar160._12_4_ = fVar358 + 1.0;
                auVar160._16_4_ = 0x3f800000;
                auVar160._20_4_ = 0x3f800000;
                auVar160._24_4_ = 0x3f800000;
                auVar160._28_4_ = 0x3f800000;
                auVar321 = vfmadd231ps_fma(auVar160,auVar19,ZEXT1632(auVar321));
                auVar305._0_4_ = (int)auVar301._0_4_;
                auVar305._4_4_ = (int)auVar301._4_4_;
                auVar305._8_4_ = (int)auVar301._8_4_;
                auVar305._12_4_ = (int)auVar301._12_4_;
                auVar305._16_4_ = (int)auVar301._16_4_;
                auVar305._20_4_ = (int)auVar301._20_4_;
                auVar305._24_4_ = (int)auVar301._24_4_;
                auVar305._28_4_ = (int)auVar301._28_4_;
                auVar301 = vpslld_avx2(auVar305,0x17);
                auVar335._8_4_ = 0x3f800000;
                auVar335._0_8_ = 0x3f8000003f800000;
                auVar335._12_4_ = 0x3f800000;
                auVar335._16_4_ = 0x3f800000;
                auVar335._20_4_ = 0x3f800000;
                auVar335._24_4_ = 0x3f800000;
                auVar335._28_4_ = 0x3f800000;
                auVar301 = vpaddd_avx2(auVar335,auVar301);
                auVar321 = vfmadd213ps_fma(auVar301,ZEXT1632(auVar321),auVar306);
                auVar301 = vrcpps_avx(ZEXT1632(auVar321));
                auVar321 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar301,auVar306);
                auVar321 = vfnmadd132ps_fma(ZEXT1632(auVar321),auVar301,auVar301);
                auVar301 = ZEXT1632(auVar321);
                break;
              case 5:
                auVar351._8_4_ = 0x42b0c0a5;
                auVar351._0_8_ = 0x42b0c0a542b0c0a5;
                auVar351._12_4_ = 0x42b0c0a5;
                auVar351._16_4_ = 0x42b0c0a5;
                auVar351._20_4_ = 0x42b0c0a5;
                auVar351._24_4_ = 0x42b0c0a5;
                auVar351._28_4_ = 0x42b0c0a5;
                auVar301 = vminps_avx(auVar301,auVar351);
                auVar369._8_4_ = 0xc2b0c0a5;
                auVar369._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar369._12_4_ = 0xc2b0c0a5;
                auVar369._16_4_ = 0xc2b0c0a5;
                auVar369._20_4_ = 0xc2b0c0a5;
                auVar369._24_4_ = 0xc2b0c0a5;
                auVar369._28_4_ = 0xc2b0c0a5;
                auVar332 = vmaxps_avx(auVar369,auVar301);
                auVar374._8_4_ = 0x3fb8aa3b;
                auVar374._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar374._12_4_ = 0x3fb8aa3b;
                auVar374._16_4_ = 0x3fb8aa3b;
                auVar374._20_4_ = 0x3fb8aa3b;
                auVar374._24_4_ = 0x3fb8aa3b;
                auVar374._28_4_ = 0x3fb8aa3b;
                auVar321 = vfmadd213ps_fma(auVar374,auVar332,auVar300);
                auVar331 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar301 = vcmpps_avx(ZEXT1632(auVar321),auVar331,1);
                auVar301 = vandps_avx(auVar301,auVar306);
                auVar301 = vsubps_avx(auVar331,auVar301);
                auVar352._8_4_ = 0x3f317218;
                auVar352._0_8_ = 0x3f3172183f317218;
                auVar352._12_4_ = 0x3f317218;
                auVar352._16_4_ = 0x3f317218;
                auVar352._20_4_ = 0x3f317218;
                auVar352._24_4_ = 0x3f317218;
                auVar352._28_4_ = 0x3f317218;
                auVar316 = vfnmadd231ps_fma(auVar332,auVar301,auVar352);
                auVar332 = ZEXT1632(auVar316);
                fVar59 = auVar316._0_4_;
                fVar356 = auVar316._4_4_;
                fVar357 = auVar316._8_4_;
                fVar358 = auVar316._12_4_;
                auVar15._28_4_ = auVar331._28_4_;
                auVar15._0_28_ =
                     ZEXT1628(CONCAT412(fVar358 * fVar358,
                                        CONCAT48(fVar357 * fVar357,
                                                 CONCAT44(fVar356 * fVar356,fVar59 * fVar59))));
                auVar389._8_4_ = 0x39506967;
                auVar389._0_8_ = 0x3950696739506967;
                auVar389._12_4_ = 0x39506967;
                auVar389._16_4_ = 0x39506967;
                auVar389._20_4_ = 0x39506967;
                auVar389._24_4_ = 0x39506967;
                auVar389._28_4_ = 0x39506967;
                auVar381._8_4_ = 0x3ab743ce;
                auVar381._0_8_ = 0x3ab743ce3ab743ce;
                auVar381._12_4_ = 0x3ab743ce;
                auVar381._16_4_ = 0x3ab743ce;
                auVar381._20_4_ = 0x3ab743ce;
                auVar381._24_4_ = 0x3ab743ce;
                auVar381._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar389,auVar332,auVar381);
                auVar206._8_4_ = 0x3c088908;
                auVar206._0_8_ = 0x3c0889083c088908;
                auVar206._12_4_ = 0x3c088908;
                auVar206._16_4_ = 0x3c088908;
                auVar206._20_4_ = 0x3c088908;
                auVar206._24_4_ = 0x3c088908;
                auVar206._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar206);
                auVar110._8_4_ = 0x3d2aa9c1;
                auVar110._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar110._12_4_ = 0x3d2aa9c1;
                auVar110._16_4_ = 0x3d2aa9c1;
                auVar110._20_4_ = 0x3d2aa9c1;
                auVar110._24_4_ = 0x3d2aa9c1;
                auVar110._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar110);
                auVar207._8_4_ = 0x3e2aaaaa;
                auVar207._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar207._12_4_ = 0x3e2aaaaa;
                auVar207._16_4_ = 0x3e2aaaaa;
                auVar207._20_4_ = 0x3e2aaaaa;
                auVar207._24_4_ = 0x3e2aaaaa;
                auVar207._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar207);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar300);
                auVar232._0_4_ = fVar59 + 1.0;
                auVar232._4_4_ = fVar356 + 1.0;
                auVar232._8_4_ = fVar357 + 1.0;
                auVar232._12_4_ = fVar358 + 1.0;
                auVar232._16_4_ = 0x3f800000;
                auVar232._20_4_ = 0x3f800000;
                auVar232._24_4_ = 0x3f800000;
                auVar232._28_4_ = 0x3f800000;
                auVar321 = vfmadd231ps_fma(auVar232,auVar15,ZEXT1632(auVar321));
                auVar156._0_4_ = (int)auVar301._0_4_;
                auVar156._4_4_ = (int)auVar301._4_4_;
                auVar156._8_4_ = (int)auVar301._8_4_;
                auVar156._12_4_ = (int)auVar301._12_4_;
                auVar156._16_4_ = (int)auVar301._16_4_;
                auVar156._20_4_ = (int)auVar301._20_4_;
                auVar156._24_4_ = (int)auVar301._24_4_;
                auVar156._28_4_ = (int)auVar301._28_4_;
                auVar301 = vpslld_avx2(auVar156,0x17);
                auVar157._8_4_ = 0x3f800000;
                auVar157._0_8_ = 0x3f8000003f800000;
                auVar157._12_4_ = 0x3f800000;
                auVar157._16_4_ = 0x3f800000;
                auVar157._20_4_ = 0x3f800000;
                auVar157._24_4_ = 0x3f800000;
                auVar157._28_4_ = 0x3f800000;
                auVar301 = vpaddd_avx2(auVar301,auVar157);
                auVar321 = vfmadd213ps_fma(auVar301,ZEXT1632(auVar321),auVar306);
                auVar233._8_4_ = 0x800000;
                auVar233._0_8_ = 0x80000000800000;
                auVar233._12_4_ = 0x800000;
                auVar233._16_4_ = 0x800000;
                auVar233._20_4_ = 0x800000;
                auVar233._24_4_ = 0x800000;
                auVar233._28_4_ = 0x800000;
                auVar301 = vmaxps_avx(ZEXT1632(auVar321),auVar233);
                auVar332 = vpsrld_avx2(auVar301,0x17);
                auVar444._8_4_ = 0x807fffff;
                auVar444._0_8_ = 0x807fffff807fffff;
                auVar444._12_4_ = 0x807fffff;
                auVar444._16_4_ = 0x807fffff;
                auVar444._20_4_ = 0x807fffff;
                auVar444._24_4_ = 0x807fffff;
                auVar444._28_4_ = 0x807fffff;
                auVar301 = vandps_avx(auVar444,auVar301);
                auVar445._8_4_ = 0x3f000000;
                auVar445._0_8_ = 0x3f0000003f000000;
                auVar445._12_4_ = 0x3f000000;
                auVar445._16_4_ = 0x3f000000;
                auVar445._20_4_ = 0x3f000000;
                auVar445._24_4_ = 0x3f000000;
                auVar445._28_4_ = 0x3f000000;
                auVar331 = vorps_avx(auVar445,auVar301);
                auVar446._8_4_ = 0xffffff82;
                auVar446._0_8_ = 0xffffff82ffffff82;
                auVar446._12_4_ = 0xffffff82;
                auVar446._16_4_ = 0xffffff82;
                auVar446._20_4_ = 0xffffff82;
                auVar446._24_4_ = 0xffffff82;
                auVar446._28_4_ = 0xffffff82;
                auVar350 = vpaddd_avx2(auVar332,auVar446);
                auVar268._8_4_ = 0x3f3504f3;
                auVar268._0_8_ = 0x3f3504f33f3504f3;
                auVar268._12_4_ = 0x3f3504f3;
                auVar268._16_4_ = 0x3f3504f3;
                auVar268._20_4_ = 0x3f3504f3;
                auVar268._24_4_ = 0x3f3504f3;
                auVar268._28_4_ = 0x3f3504f3;
                auVar332 = vcmpps_avx(auVar331,auVar268,1);
                auVar301 = vandps_avx(auVar332,auVar331);
                auVar111._8_4_ = 0xbf800000;
                auVar111._0_8_ = 0xbf800000bf800000;
                auVar111._12_4_ = 0xbf800000;
                auVar111._16_4_ = 0xbf800000;
                auVar111._20_4_ = 0xbf800000;
                auVar111._24_4_ = 0xbf800000;
                auVar111._28_4_ = 0xbf800000;
                auVar234._0_4_ = auVar331._0_4_ + -1.0 + auVar301._0_4_;
                auVar234._4_4_ = auVar331._4_4_ + -1.0 + auVar301._4_4_;
                auVar234._8_4_ = auVar331._8_4_ + -1.0 + auVar301._8_4_;
                auVar234._12_4_ = auVar331._12_4_ + -1.0 + auVar301._12_4_;
                auVar234._16_4_ = auVar331._16_4_ + -1.0 + auVar301._16_4_;
                auVar234._20_4_ = auVar331._20_4_ + -1.0 + auVar301._20_4_;
                auVar234._24_4_ = auVar331._24_4_ + -1.0 + auVar301._24_4_;
                auVar234._28_4_ = auVar331._28_4_ + -1.0 + auVar301._28_4_;
                auVar331 = vcmpps_avx(ZEXT1632(auVar321),_DAT_00320640,2);
                auVar350 = vcvtdq2ps_avx(auVar350);
                auVar301 = vandps_avx(auVar332,auVar306);
                auVar301 = vsubps_avx(auVar350,auVar301);
                auVar333._8_4_ = 0x3d9021bb;
                auVar333._0_8_ = 0x3d9021bb3d9021bb;
                auVar333._12_4_ = 0x3d9021bb;
                auVar333._16_4_ = 0x3d9021bb;
                auVar333._20_4_ = 0x3d9021bb;
                auVar333._24_4_ = 0x3d9021bb;
                auVar333._28_4_ = 0x3d9021bb;
                auVar447._8_4_ = 0xbdebd1b8;
                auVar447._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar447._12_4_ = 0xbdebd1b8;
                auVar447._16_4_ = 0xbdebd1b8;
                auVar447._20_4_ = 0xbdebd1b8;
                auVar447._24_4_ = 0xbdebd1b8;
                auVar447._28_4_ = 0xbdebd1b8;
                auVar321 = vfmadd213ps_fma(auVar333,auVar234,auVar447);
                auVar448._8_4_ = 0x3def251a;
                auVar448._0_8_ = 0x3def251a3def251a;
                auVar448._12_4_ = 0x3def251a;
                auVar448._16_4_ = 0x3def251a;
                auVar448._20_4_ = 0x3def251a;
                auVar448._24_4_ = 0x3def251a;
                auVar448._28_4_ = 0x3def251a;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar448);
                auVar449._8_4_ = 0xbdfe5d4f;
                auVar449._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar449._12_4_ = 0xbdfe5d4f;
                auVar449._16_4_ = 0xbdfe5d4f;
                auVar449._20_4_ = 0xbdfe5d4f;
                auVar449._24_4_ = 0xbdfe5d4f;
                auVar449._28_4_ = 0xbdfe5d4f;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar449);
                auVar450._8_4_ = 0x3e11e9bf;
                auVar450._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar450._12_4_ = 0x3e11e9bf;
                auVar450._16_4_ = 0x3e11e9bf;
                auVar450._20_4_ = 0x3e11e9bf;
                auVar450._24_4_ = 0x3e11e9bf;
                auVar450._28_4_ = 0x3e11e9bf;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar450);
                auVar451._8_4_ = 0xbe2aae50;
                auVar451._0_8_ = 0xbe2aae50be2aae50;
                auVar451._12_4_ = 0xbe2aae50;
                auVar451._16_4_ = 0xbe2aae50;
                auVar451._20_4_ = 0xbe2aae50;
                auVar451._24_4_ = 0xbe2aae50;
                auVar451._28_4_ = 0xbe2aae50;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar451);
                auVar452._8_4_ = 0x3e4cceac;
                auVar452._0_8_ = 0x3e4cceac3e4cceac;
                auVar452._12_4_ = 0x3e4cceac;
                auVar452._16_4_ = 0x3e4cceac;
                auVar452._20_4_ = 0x3e4cceac;
                auVar452._24_4_ = 0x3e4cceac;
                auVar452._28_4_ = 0x3e4cceac;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar452);
                auVar453._8_4_ = 0xbe7ffffc;
                auVar453._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar453._12_4_ = 0xbe7ffffc;
                auVar453._16_4_ = 0xbe7ffffc;
                auVar453._20_4_ = 0xbe7ffffc;
                auVar453._24_4_ = 0xbe7ffffc;
                auVar453._28_4_ = 0xbe7ffffc;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar453);
                auVar454._8_4_ = 0x3eaaaaaa;
                auVar454._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar454._12_4_ = 0x3eaaaaaa;
                auVar454._16_4_ = 0x3eaaaaaa;
                auVar454._20_4_ = 0x3eaaaaaa;
                auVar454._24_4_ = 0x3eaaaaaa;
                auVar454._28_4_ = 0x3eaaaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar234,auVar454);
                auVar316 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar234,auVar300);
                auVar321 = vfmadd213ps_fma(auVar301,auVar352,auVar234);
                auVar16._4_4_ = auVar234._4_4_ * auVar234._4_4_;
                auVar16._0_4_ = auVar234._0_4_ * auVar234._0_4_;
                auVar16._8_4_ = auVar234._8_4_ * auVar234._8_4_;
                auVar16._12_4_ = auVar234._12_4_ * auVar234._12_4_;
                auVar16._16_4_ = auVar234._16_4_ * auVar234._16_4_;
                auVar16._20_4_ = auVar234._20_4_ * auVar234._20_4_;
                auVar16._24_4_ = auVar234._24_4_ * auVar234._24_4_;
                auVar16._28_4_ = auVar234._28_4_;
                auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar16,ZEXT1632(auVar316));
                auVar455._8_4_ = 0xc0000000;
                auVar455._0_8_ = 0xc0000000c0000000;
                auVar455._12_4_ = 0xc0000000;
                auVar455._16_4_ = 0xc0000000;
                auVar455._20_4_ = 0xc0000000;
                auVar455._24_4_ = 0xc0000000;
                auVar455._28_4_ = 0xc0000000;
                auVar17._4_4_ = auVar321._4_4_ * -2.0;
                auVar17._0_4_ = auVar321._0_4_ * -2.0;
                auVar17._8_4_ = auVar321._8_4_ * -2.0;
                auVar17._12_4_ = auVar321._12_4_ * -2.0;
                auVar17._16_4_ = 0x80000000;
                auVar17._20_4_ = 0x80000000;
                auVar17._24_4_ = 0x80000000;
                auVar17._28_4_ = auVar234._28_4_;
                auVar302._8_4_ = 0x7fffffff;
                auVar302._0_8_ = 0x7fffffff7fffffff;
                auVar302._12_4_ = 0x7fffffff;
                auVar302._16_4_ = 0x7fffffff;
                auVar302._20_4_ = 0x7fffffff;
                auVar302._24_4_ = 0x7fffffff;
                auVar302._28_4_ = 0x7fffffff;
                auVar301 = vblendvps_avx(auVar17,auVar302,auVar331);
                auVar269._8_4_ = 0x42b0c0a5;
                auVar269._0_8_ = 0x42b0c0a542b0c0a5;
                auVar269._12_4_ = 0x42b0c0a5;
                auVar269._16_4_ = 0x42b0c0a5;
                auVar269._20_4_ = 0x42b0c0a5;
                auVar269._24_4_ = 0x42b0c0a5;
                auVar269._28_4_ = 0x42b0c0a5;
                auVar301 = vminps_avx(auVar301,auVar269);
                auVar332 = vmaxps_avx(auVar369,auVar301);
                auVar377 = ZEXT864(0) << 0x20;
                auVar321 = vfmadd213ps_fma(auVar374,auVar332,auVar300);
                auVar331 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar301 = vcmpps_avx(ZEXT1632(auVar321),auVar331,1);
                auVar301 = vandps_avx(auVar301,auVar306);
                auVar301 = vsubps_avx(auVar331,auVar301);
                auVar316 = vfnmadd231ps_fma(auVar332,auVar301,auVar352);
                auVar332 = ZEXT1632(auVar316);
                fVar59 = auVar316._0_4_;
                fVar356 = auVar316._4_4_;
                fVar357 = auVar316._8_4_;
                fVar358 = auVar316._12_4_;
                auVar18._28_4_ = auVar331._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(fVar358 * fVar358,
                                        CONCAT48(fVar357 * fVar357,
                                                 CONCAT44(fVar356 * fVar356,fVar59 * fVar59))));
                auVar321 = vfmadd213ps_fma(auVar389,auVar332,auVar381);
                auVar385 = ZEXT3264(auVar300);
                auVar282._8_4_ = 0x3c088908;
                auVar282._0_8_ = 0x3c0889083c088908;
                auVar282._12_4_ = 0x3c088908;
                auVar282._16_4_ = 0x3c088908;
                auVar282._20_4_ = 0x3c088908;
                auVar282._24_4_ = 0x3c088908;
                auVar282._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar282);
                auVar283._8_4_ = 0x3d2aa9c1;
                auVar283._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar283._12_4_ = 0x3d2aa9c1;
                auVar283._16_4_ = 0x3d2aa9c1;
                auVar283._20_4_ = 0x3d2aa9c1;
                auVar283._24_4_ = 0x3d2aa9c1;
                auVar283._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar283);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar207);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar300);
                auVar235._0_4_ = fVar59 + 1.0;
                auVar235._4_4_ = fVar356 + 1.0;
                auVar235._8_4_ = fVar357 + 1.0;
                auVar235._12_4_ = fVar358 + 1.0;
                auVar235._16_4_ = 0x3f800000;
                auVar235._20_4_ = 0x3f800000;
                auVar235._24_4_ = 0x3f800000;
                auVar235._28_4_ = 0x3f800000;
                auVar321 = vfmadd231ps_fma(auVar235,auVar18,ZEXT1632(auVar321));
                auVar270._0_4_ = (int)auVar301._0_4_;
                auVar270._4_4_ = (int)auVar301._4_4_;
                auVar270._8_4_ = (int)auVar301._8_4_;
                auVar270._12_4_ = (int)auVar301._12_4_;
                auVar270._16_4_ = (int)auVar301._16_4_;
                auVar270._20_4_ = (int)auVar301._20_4_;
                auVar270._24_4_ = (int)auVar301._24_4_;
                auVar270._28_4_ = (int)auVar301._28_4_;
                auVar301 = vpslld_avx2(auVar270,0x17);
                auVar301 = vpaddd_avx2(auVar301,auVar157);
                auVar321 = vfmadd213ps_fma(auVar301,ZEXT1632(auVar321),auVar306);
                auVar301 = vrcpps_avx(ZEXT1632(auVar321));
                auVar321 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar301,auVar306);
                auVar321 = vfnmadd132ps_fma(ZEXT1632(auVar321),auVar301,auVar301);
                auVar321 = vfnmadd213ps_fma(ZEXT1632(auVar321),auVar455,auVar111);
                auVar155 = ZEXT1628(auVar321);
                goto LAB_0030f79d;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar161._4_4_ = uVar1;
                auVar161._0_4_ = uVar1;
                auVar161._8_4_ = uVar1;
                auVar161._12_4_ = uVar1;
                auVar161._16_4_ = uVar1;
                auVar161._20_4_ = uVar1;
                auVar161._24_4_ = uVar1;
                auVar161._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar240._4_4_ = uVar1;
                auVar240._0_4_ = uVar1;
                auVar240._8_4_ = uVar1;
                auVar240._12_4_ = uVar1;
                auVar240._16_4_ = uVar1;
                auVar240._20_4_ = uVar1;
                auVar240._24_4_ = uVar1;
                auVar240._28_4_ = uVar1;
                auVar321 = vfmadd231ps_fma(auVar240,auVar301,auVar161);
                auVar301 = vmaxps_avx(auVar332,ZEXT1632(auVar321));
                auVar301 = vminps_avx(auVar301,auVar306);
                auVar155 = auVar301._0_28_;
LAB_0030f79d:
                auVar175._0_4_ = auVar424._0_4_ * auVar155._0_4_;
                auVar175._4_4_ = auVar424._4_4_ * auVar155._4_4_;
                auVar175._8_4_ = auVar424._8_4_ * auVar155._8_4_;
                auVar175._12_4_ = auVar424._12_4_ * auVar155._12_4_;
                auVar175._16_4_ = auVar424._16_4_ * auVar155._16_4_;
                auVar175._20_4_ = auVar424._20_4_ * auVar155._20_4_;
                auVar175._24_4_ = auVar424._24_4_ * auVar155._24_4_;
                auVar301 = auVar175._0_32_;
              }
              *pauVar47 = auVar301;
              pauVar47 = pauVar47 + 1;
              iVar52 = iVar52 + 8;
              bVar58 = iVar54 != iVar3;
              iVar54 = iVar54 + 1;
            } while (bVar58);
          }
          local_148 = local_148 + 1;
        } while (local_148 != _h);
      }
      if ((uVar2 == 1 && uVar35 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        uVar48 = 0;
        auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar424 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar175 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar277._8_4_ = 0x3f000000;
        auVar277._0_8_ = 0x3f0000003f000000;
        auVar277._12_4_ = 0x3f000000;
        auVar277._16_4_ = 0x3f000000;
        auVar277._20_4_ = 0x3f000000;
        auVar277._24_4_ = 0x3f000000;
        auVar277._28_4_ = 0x3f000000;
        auVar385 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar390._8_4_ = 0x3c088908;
        auVar390._0_8_ = 0x3c0889083c088908;
        auVar390._12_4_ = 0x3c088908;
        auVar390._16_4_ = 0x3c088908;
        auVar390._20_4_ = 0x3c088908;
        auVar390._24_4_ = 0x3c088908;
        auVar390._28_4_ = 0x3c088908;
        do {
          if (-1 < iVar3) {
            pauVar47 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar48 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar54 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar459 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar459 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar48 * 0x20))
                ;
              }
              if (0 < iVar32) {
                pauVar55 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * uVar48 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                puVar42 = (undefined4 *)
                          ((long)(_func_int ***)local_b8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar54) * 4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    puVar36 = puVar42;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      uVar1 = *puVar36;
                      auVar162._4_4_ = uVar1;
                      auVar162._0_4_ = uVar1;
                      auVar162._8_4_ = uVar1;
                      auVar162._12_4_ = uVar1;
                      auVar162._16_4_ = uVar1;
                      auVar162._20_4_ = uVar1;
                      auVar162._24_4_ = uVar1;
                      auVar162._28_4_ = uVar1;
                      auVar321 = vfmadd231ps_fma(auVar459._0_32_,auVar162,*pauVar55);
                      auVar459 = ZEXT1664(auVar321);
                      pauVar55 = pauVar55 + 1;
                      puVar36 = puVar36 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  uVar39 = uVar39 + 1;
                  puVar42 = (undefined4 *)((long)puVar42 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar39 != uVar53);
              }
              auVar306 = auVar459._0_32_;
              p_Var4 = pp_Var5[-3];
              auVar301 = auVar377._0_32_;
              auVar332 = auVar385._0_32_;
              auVar331 = auVar424._0_32_;
              auVar300 = auVar175._0_32_;
              fVar59 = auVar385._0_4_;
              fVar356 = auVar385._4_4_;
              fVar357 = auVar385._8_4_;
              fVar358 = auVar385._12_4_;
              fVar217 = auVar385._16_4_;
              fVar359 = auVar385._20_4_;
              fVar360 = auVar385._24_4_;
              fVar361 = auVar385._28_4_;
              auVar460._28_36_ = auVar459._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar306 = vmaxps_avx(auVar306,auVar301);
                break;
              case 2:
                auVar332 = vmaxps_avx(auVar306,auVar301);
                auVar306 = vminps_avx(auVar306,auVar301);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar456._4_4_ = uVar1;
                auVar456._0_4_ = uVar1;
                auVar456._8_4_ = uVar1;
                auVar456._12_4_ = uVar1;
                auVar456._16_4_ = uVar1;
                auVar456._20_4_ = uVar1;
                auVar456._24_4_ = uVar1;
                auVar456._28_4_ = uVar1;
                auVar321 = vfmadd213ps_fma(auVar456,auVar306,auVar332);
                auVar306 = ZEXT1632(auVar321);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar165._4_4_ = uVar1;
                auVar165._0_4_ = uVar1;
                auVar165._8_4_ = uVar1;
                auVar165._12_4_ = uVar1;
                auVar165._16_4_ = uVar1;
                auVar165._20_4_ = uVar1;
                auVar165._24_4_ = uVar1;
                auVar165._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar308._4_4_ = uVar1;
                auVar308._0_4_ = uVar1;
                auVar308._8_4_ = uVar1;
                auVar308._12_4_ = uVar1;
                auVar308._16_4_ = uVar1;
                auVar308._20_4_ = uVar1;
                auVar308._24_4_ = uVar1;
                auVar308._28_4_ = uVar1;
                auVar306 = vmaxps_avx(auVar306,auVar165);
                auVar306 = vminps_avx(auVar306,auVar308);
                break;
              case 4:
                auVar166._0_8_ = auVar459._0_8_ ^ 0x8000000080000000;
                auVar166._8_4_ = -auVar459._8_4_;
                auVar166._12_4_ = -auVar459._12_4_;
                auVar166._16_4_ = -auVar459._16_4_;
                auVar166._20_4_ = -auVar459._20_4_;
                auVar166._24_4_ = -auVar459._24_4_;
                auVar166._28_4_ = auVar459._28_4_ ^ 0x80000000;
                auVar128._8_4_ = 0x42b0c0a5;
                auVar128._0_8_ = 0x42b0c0a542b0c0a5;
                auVar128._12_4_ = 0x42b0c0a5;
                auVar128._16_4_ = 0x42b0c0a5;
                auVar128._20_4_ = 0x42b0c0a5;
                auVar128._24_4_ = 0x42b0c0a5;
                auVar128._28_4_ = 0x42b0c0a5;
                auVar306 = vminps_avx(auVar166,auVar128);
                auVar301 = vmaxps_avx(auVar331,auVar306);
                auVar321 = vfmadd213ps_fma(auVar300,auVar301,auVar277);
                auVar300 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar306 = vcmpps_avx(ZEXT1632(auVar321),auVar300,1);
                auVar306 = vandps_avx(auVar306,auVar332);
                auVar306 = vsubps_avx(auVar300,auVar306);
                auVar244._8_4_ = 0xbf317218;
                auVar244._0_8_ = 0xbf317218bf317218;
                auVar244._12_4_ = 0xbf317218;
                auVar244._16_4_ = 0xbf317218;
                auVar244._20_4_ = 0xbf317218;
                auVar244._24_4_ = 0xbf317218;
                auVar244._28_4_ = 0xbf317218;
                auVar316 = vfmadd231ps_fma(auVar301,auVar306,auVar244);
                auVar301 = ZEXT1632(auVar316);
                fVar11 = auVar316._0_4_;
                fVar12 = auVar316._4_4_;
                fVar13 = auVar316._8_4_;
                fVar14 = auVar316._12_4_;
                auVar24._28_4_ = auVar300._28_4_;
                auVar24._0_28_ =
                     ZEXT1628(CONCAT412(fVar14 * fVar14,
                                        CONCAT48(fVar13 * fVar13,
                                                 CONCAT44(fVar12 * fVar12,fVar11 * fVar11))));
                auVar337._8_4_ = 0x39506967;
                auVar337._0_8_ = 0x3950696739506967;
                auVar337._12_4_ = 0x39506967;
                auVar337._16_4_ = 0x39506967;
                auVar337._20_4_ = 0x39506967;
                auVar337._24_4_ = 0x39506967;
                auVar337._28_4_ = 0x39506967;
                auVar211._8_4_ = 0x3ab743ce;
                auVar211._0_8_ = 0x3ab743ce3ab743ce;
                auVar211._12_4_ = 0x3ab743ce;
                auVar211._16_4_ = 0x3ab743ce;
                auVar211._20_4_ = 0x3ab743ce;
                auVar211._24_4_ = 0x3ab743ce;
                auVar211._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar337,auVar301,auVar211);
                auVar212._8_4_ = 0x3c088908;
                auVar212._0_8_ = 0x3c0889083c088908;
                auVar212._12_4_ = 0x3c088908;
                auVar212._16_4_ = 0x3c088908;
                auVar212._20_4_ = 0x3c088908;
                auVar212._24_4_ = 0x3c088908;
                auVar212._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar301,auVar212);
                auVar129._8_4_ = 0x3d2aa9c1;
                auVar129._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar129._12_4_ = 0x3d2aa9c1;
                auVar129._16_4_ = 0x3d2aa9c1;
                auVar129._20_4_ = 0x3d2aa9c1;
                auVar129._24_4_ = 0x3d2aa9c1;
                auVar129._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar301,auVar129);
                auVar130._8_4_ = 0x3e2aaaaa;
                auVar130._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar130._12_4_ = 0x3e2aaaaa;
                auVar130._16_4_ = 0x3e2aaaaa;
                auVar130._20_4_ = 0x3e2aaaaa;
                auVar130._24_4_ = 0x3e2aaaaa;
                auVar130._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar130);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar277);
                auVar167._0_4_ = fVar11 + fVar59;
                auVar167._4_4_ = fVar12 + fVar356;
                auVar167._8_4_ = fVar13 + fVar357;
                auVar167._12_4_ = fVar14 + fVar358;
                auVar167._16_4_ = fVar217 + 0.0;
                auVar167._20_4_ = fVar359 + 0.0;
                auVar167._24_4_ = fVar360 + 0.0;
                auVar167._28_4_ = fVar361 + 0.0;
                auVar321 = vfmadd231ps_fma(auVar167,auVar24,ZEXT1632(auVar321));
                auVar309._0_4_ = (int)auVar306._0_4_;
                auVar309._4_4_ = (int)auVar306._4_4_;
                auVar309._8_4_ = (int)auVar306._8_4_;
                auVar309._12_4_ = (int)auVar306._12_4_;
                auVar309._16_4_ = (int)auVar306._16_4_;
                auVar309._20_4_ = (int)auVar306._20_4_;
                auVar309._24_4_ = (int)auVar306._24_4_;
                auVar309._28_4_ = (int)auVar306._28_4_;
                auVar306 = vpslld_avx2(auVar309,0x17);
                auVar338._8_4_ = 0x3f800000;
                auVar338._0_8_ = 0x3f8000003f800000;
                auVar338._12_4_ = 0x3f800000;
                auVar338._16_4_ = 0x3f800000;
                auVar338._20_4_ = 0x3f800000;
                auVar338._24_4_ = 0x3f800000;
                auVar338._28_4_ = 0x3f800000;
                auVar306 = vpaddd_avx2(auVar338,auVar306);
                auVar321 = vfmadd213ps_fma(auVar306,ZEXT1632(auVar321),auVar332);
                auVar306 = vrcpps_avx(ZEXT1632(auVar321));
                auVar321 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar306,auVar332);
                auVar321 = vfnmadd132ps_fma(ZEXT1632(auVar321),auVar306,auVar306);
                auVar306 = ZEXT1632(auVar321);
                break;
              case 5:
                auVar114._8_4_ = 0x42b0c0a5;
                auVar114._0_8_ = 0x42b0c0a542b0c0a5;
                auVar114._12_4_ = 0x42b0c0a5;
                auVar114._16_4_ = 0x42b0c0a5;
                auVar114._20_4_ = 0x42b0c0a5;
                auVar114._24_4_ = 0x42b0c0a5;
                auVar114._28_4_ = 0x42b0c0a5;
                auVar306 = vminps_avx(auVar306,auVar114);
                auVar301 = vmaxps_avx(auVar331,auVar306);
                auVar321 = vfmadd213ps_fma(auVar300,auVar301,auVar277);
                auVar350 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar306 = vcmpps_avx(ZEXT1632(auVar321),auVar350,1);
                auVar306 = vandps_avx(auVar306,auVar332);
                auVar306 = vsubps_avx(auVar350,auVar306);
                auVar284._8_4_ = 0x3f317218;
                auVar284._0_8_ = 0x3f3172183f317218;
                auVar284._12_4_ = 0x3f317218;
                auVar284._16_4_ = 0x3f317218;
                auVar284._20_4_ = 0x3f317218;
                auVar284._24_4_ = 0x3f317218;
                auVar284._28_4_ = 0x3f317218;
                auVar316 = vfnmadd231ps_fma(auVar301,auVar306,auVar284);
                auVar301 = ZEXT1632(auVar316);
                fVar11 = auVar316._0_4_;
                fVar12 = auVar316._4_4_;
                fVar13 = auVar316._8_4_;
                fVar14 = auVar316._12_4_;
                auVar20._28_4_ = auVar350._28_4_;
                auVar20._0_28_ =
                     ZEXT1628(CONCAT412(fVar14 * fVar14,
                                        CONCAT48(fVar13 * fVar13,
                                                 CONCAT44(fVar12 * fVar12,fVar11 * fVar11))));
                auVar382._8_4_ = 0x39506967;
                auVar382._0_8_ = 0x3950696739506967;
                auVar382._12_4_ = 0x39506967;
                auVar382._16_4_ = 0x39506967;
                auVar382._20_4_ = 0x39506967;
                auVar382._24_4_ = 0x39506967;
                auVar382._28_4_ = 0x39506967;
                auVar209._8_4_ = 0x3ab743ce;
                auVar209._0_8_ = 0x3ab743ce3ab743ce;
                auVar209._12_4_ = 0x3ab743ce;
                auVar209._16_4_ = 0x3ab743ce;
                auVar209._20_4_ = 0x3ab743ce;
                auVar209._24_4_ = 0x3ab743ce;
                auVar209._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar382,auVar301,auVar209);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar301,auVar390);
                auVar115._8_4_ = 0x3d2aa9c1;
                auVar115._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar115._12_4_ = 0x3d2aa9c1;
                auVar115._16_4_ = 0x3d2aa9c1;
                auVar115._20_4_ = 0x3d2aa9c1;
                auVar115._24_4_ = 0x3d2aa9c1;
                auVar115._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar301,auVar115);
                auVar116._8_4_ = 0x3e2aaaaa;
                auVar116._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar116._12_4_ = 0x3e2aaaaa;
                auVar116._16_4_ = 0x3e2aaaaa;
                auVar116._20_4_ = 0x3e2aaaaa;
                auVar116._24_4_ = 0x3e2aaaaa;
                auVar116._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar116);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar277);
                auVar241._0_4_ = fVar59 + fVar11;
                auVar241._4_4_ = fVar356 + fVar12;
                auVar241._8_4_ = fVar357 + fVar13;
                auVar241._12_4_ = fVar358 + fVar14;
                auVar241._16_4_ = fVar217 + 0.0;
                auVar241._20_4_ = fVar359 + 0.0;
                auVar241._24_4_ = fVar360 + 0.0;
                auVar241._28_4_ = fVar361 + 0.0;
                auVar321 = vfmadd231ps_fma(auVar241,auVar20,ZEXT1632(auVar321));
                auVar163._0_4_ = (int)auVar306._0_4_;
                auVar163._4_4_ = (int)auVar306._4_4_;
                auVar163._8_4_ = (int)auVar306._8_4_;
                auVar163._12_4_ = (int)auVar306._12_4_;
                auVar163._16_4_ = (int)auVar306._16_4_;
                auVar163._20_4_ = (int)auVar306._20_4_;
                auVar163._24_4_ = (int)auVar306._24_4_;
                auVar163._28_4_ = (int)auVar306._28_4_;
                auVar306 = vpslld_avx2(auVar163,0x17);
                auVar164._8_4_ = 0x3f800000;
                auVar164._0_8_ = 0x3f8000003f800000;
                auVar164._12_4_ = 0x3f800000;
                auVar164._16_4_ = 0x3f800000;
                auVar164._20_4_ = 0x3f800000;
                auVar164._24_4_ = 0x3f800000;
                auVar164._28_4_ = 0x3f800000;
                auVar306 = vpaddd_avx2(auVar306,auVar164);
                auVar321 = vfmadd213ps_fma(auVar306,ZEXT1632(auVar321),auVar332);
                auVar117._8_4_ = 0x800000;
                auVar117._0_8_ = 0x80000000800000;
                auVar117._12_4_ = 0x800000;
                auVar117._16_4_ = 0x800000;
                auVar117._20_4_ = 0x800000;
                auVar117._24_4_ = 0x800000;
                auVar117._28_4_ = 0x800000;
                auVar306 = vmaxps_avx(ZEXT1632(auVar321),auVar117);
                auVar301 = vpsrld_avx2(auVar306,0x17);
                auVar408._8_4_ = 0x807fffff;
                auVar408._0_8_ = 0x807fffff807fffff;
                auVar408._12_4_ = 0x807fffff;
                auVar408._16_4_ = 0x807fffff;
                auVar408._20_4_ = 0x807fffff;
                auVar408._24_4_ = 0x807fffff;
                auVar408._28_4_ = 0x807fffff;
                auVar306 = vandps_avx(auVar408,auVar306);
                auVar409._8_4_ = 0x3f000000;
                auVar409._0_8_ = 0x3f0000003f000000;
                auVar409._12_4_ = 0x3f000000;
                auVar409._16_4_ = 0x3f000000;
                auVar409._20_4_ = 0x3f000000;
                auVar409._24_4_ = 0x3f000000;
                auVar409._28_4_ = 0x3f000000;
                auVar350 = vorps_avx(auVar409,auVar306);
                auVar410._8_4_ = 0xffffff82;
                auVar410._0_8_ = 0xffffff82ffffff82;
                auVar410._12_4_ = 0xffffff82;
                auVar410._16_4_ = 0xffffff82;
                auVar410._20_4_ = 0xffffff82;
                auVar410._24_4_ = 0xffffff82;
                auVar410._28_4_ = 0xffffff82;
                auVar368 = vpaddd_avx2(auVar301,auVar410);
                auVar118._8_4_ = 0x3f3504f3;
                auVar118._0_8_ = 0x3f3504f33f3504f3;
                auVar118._12_4_ = 0x3f3504f3;
                auVar118._16_4_ = 0x3f3504f3;
                auVar118._20_4_ = 0x3f3504f3;
                auVar118._24_4_ = 0x3f3504f3;
                auVar118._28_4_ = 0x3f3504f3;
                auVar301 = vcmpps_avx(auVar350,auVar118,1);
                auVar306 = vandps_avx(auVar301,auVar350);
                auVar210._8_4_ = 0xbf800000;
                auVar210._0_8_ = 0xbf800000bf800000;
                auVar210._12_4_ = 0xbf800000;
                auVar210._16_4_ = 0xbf800000;
                auVar210._20_4_ = 0xbf800000;
                auVar210._24_4_ = 0xbf800000;
                auVar210._28_4_ = 0xbf800000;
                auVar242._0_4_ = auVar350._0_4_ + -1.0 + auVar306._0_4_;
                auVar242._4_4_ = auVar350._4_4_ + -1.0 + auVar306._4_4_;
                auVar242._8_4_ = auVar350._8_4_ + -1.0 + auVar306._8_4_;
                auVar242._12_4_ = auVar350._12_4_ + -1.0 + auVar306._12_4_;
                auVar242._16_4_ = auVar350._16_4_ + -1.0 + auVar306._16_4_;
                auVar242._20_4_ = auVar350._20_4_ + -1.0 + auVar306._20_4_;
                auVar242._24_4_ = auVar350._24_4_ + -1.0 + auVar306._24_4_;
                auVar242._28_4_ = auVar350._28_4_ + -1.0 + auVar306._28_4_;
                auVar350 = vcmpps_avx(ZEXT1632(auVar321),ZEXT832(0) << 0x20,2);
                auVar368 = vcvtdq2ps_avx(auVar368);
                auVar306 = vandps_avx(auVar301,auVar332);
                auVar424 = ZEXT3264(auVar331);
                auVar175 = ZEXT3264(auVar300);
                auVar306 = vsubps_avx(auVar368,auVar306);
                auVar336._8_4_ = 0x3d9021bb;
                auVar336._0_8_ = 0x3d9021bb3d9021bb;
                auVar336._12_4_ = 0x3d9021bb;
                auVar336._16_4_ = 0x3d9021bb;
                auVar336._20_4_ = 0x3d9021bb;
                auVar336._24_4_ = 0x3d9021bb;
                auVar336._28_4_ = 0x3d9021bb;
                auVar119._8_4_ = 0xbdebd1b8;
                auVar119._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar119._12_4_ = 0xbdebd1b8;
                auVar119._16_4_ = 0xbdebd1b8;
                auVar119._20_4_ = 0xbdebd1b8;
                auVar119._24_4_ = 0xbdebd1b8;
                auVar119._28_4_ = 0xbdebd1b8;
                auVar321 = vfmadd213ps_fma(auVar336,auVar242,auVar119);
                auVar120._8_4_ = 0x3def251a;
                auVar120._0_8_ = 0x3def251a3def251a;
                auVar120._12_4_ = 0x3def251a;
                auVar120._16_4_ = 0x3def251a;
                auVar120._20_4_ = 0x3def251a;
                auVar120._24_4_ = 0x3def251a;
                auVar120._28_4_ = 0x3def251a;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar120);
                auVar121._8_4_ = 0xbdfe5d4f;
                auVar121._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar121._12_4_ = 0xbdfe5d4f;
                auVar121._16_4_ = 0xbdfe5d4f;
                auVar121._20_4_ = 0xbdfe5d4f;
                auVar121._24_4_ = 0xbdfe5d4f;
                auVar121._28_4_ = 0xbdfe5d4f;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar121);
                auVar122._8_4_ = 0x3e11e9bf;
                auVar122._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar122._12_4_ = 0x3e11e9bf;
                auVar122._16_4_ = 0x3e11e9bf;
                auVar122._20_4_ = 0x3e11e9bf;
                auVar122._24_4_ = 0x3e11e9bf;
                auVar122._28_4_ = 0x3e11e9bf;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar122);
                auVar123._8_4_ = 0xbe2aae50;
                auVar123._0_8_ = 0xbe2aae50be2aae50;
                auVar123._12_4_ = 0xbe2aae50;
                auVar123._16_4_ = 0xbe2aae50;
                auVar123._20_4_ = 0xbe2aae50;
                auVar123._24_4_ = 0xbe2aae50;
                auVar123._28_4_ = 0xbe2aae50;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar123);
                auVar124._8_4_ = 0x3e4cceac;
                auVar124._0_8_ = 0x3e4cceac3e4cceac;
                auVar124._12_4_ = 0x3e4cceac;
                auVar124._16_4_ = 0x3e4cceac;
                auVar124._20_4_ = 0x3e4cceac;
                auVar124._24_4_ = 0x3e4cceac;
                auVar124._28_4_ = 0x3e4cceac;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar124);
                auVar125._8_4_ = 0xbe7ffffc;
                auVar125._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar125._12_4_ = 0xbe7ffffc;
                auVar125._16_4_ = 0xbe7ffffc;
                auVar125._20_4_ = 0xbe7ffffc;
                auVar125._24_4_ = 0xbe7ffffc;
                auVar125._28_4_ = 0xbe7ffffc;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar125);
                auVar126._8_4_ = 0x3eaaaaaa;
                auVar126._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar126._12_4_ = 0x3eaaaaaa;
                auVar126._16_4_ = 0x3eaaaaaa;
                auVar126._20_4_ = 0x3eaaaaaa;
                auVar126._24_4_ = 0x3eaaaaaa;
                auVar126._28_4_ = 0x3eaaaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar242,auVar126);
                auVar316 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar242,auVar277);
                auVar375._8_4_ = 0x3f317218;
                auVar375._0_8_ = 0x3f3172183f317218;
                auVar375._12_4_ = 0x3f317218;
                auVar375._16_4_ = 0x3f317218;
                auVar375._20_4_ = 0x3f317218;
                auVar375._24_4_ = 0x3f317218;
                auVar375._28_4_ = 0x3f317218;
                auVar321 = vfmadd213ps_fma(auVar306,auVar375,auVar242);
                auVar21._4_4_ = auVar242._4_4_ * auVar242._4_4_;
                auVar21._0_4_ = auVar242._0_4_ * auVar242._0_4_;
                auVar21._8_4_ = auVar242._8_4_ * auVar242._8_4_;
                auVar21._12_4_ = auVar242._12_4_ * auVar242._12_4_;
                auVar21._16_4_ = auVar242._16_4_ * auVar242._16_4_;
                auVar21._20_4_ = auVar242._20_4_ * auVar242._20_4_;
                auVar21._24_4_ = auVar242._24_4_ * auVar242._24_4_;
                auVar21._28_4_ = auVar242._28_4_;
                auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar21,ZEXT1632(auVar316));
                auVar127._8_4_ = 0xc0000000;
                auVar127._0_8_ = 0xc0000000c0000000;
                auVar127._12_4_ = 0xc0000000;
                auVar127._16_4_ = 0xc0000000;
                auVar127._20_4_ = 0xc0000000;
                auVar127._24_4_ = 0xc0000000;
                auVar127._28_4_ = 0xc0000000;
                auVar22._4_4_ = auVar321._4_4_ * -2.0;
                auVar22._0_4_ = auVar321._0_4_ * -2.0;
                auVar22._8_4_ = auVar321._8_4_ * -2.0;
                auVar22._12_4_ = auVar321._12_4_ * -2.0;
                auVar22._16_4_ = 0x80000000;
                auVar22._20_4_ = 0x80000000;
                auVar22._24_4_ = 0x80000000;
                auVar22._28_4_ = auVar242._28_4_;
                auVar307._8_4_ = 0x7fffffff;
                auVar307._0_8_ = 0x7fffffff7fffffff;
                auVar307._12_4_ = 0x7fffffff;
                auVar307._16_4_ = 0x7fffffff;
                auVar307._20_4_ = 0x7fffffff;
                auVar307._24_4_ = 0x7fffffff;
                auVar307._28_4_ = 0x7fffffff;
                auVar306 = vblendvps_avx(auVar22,auVar307,auVar350);
                auVar306 = vminps_avx(auVar306,auVar114);
                auVar301 = vmaxps_avx(auVar331,auVar306);
                auVar321 = vfmadd213ps_fma(auVar300,auVar301,auVar277);
                auVar300 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar306 = vcmpps_avx(ZEXT1632(auVar321),auVar300,1);
                auVar306 = vandps_avx(auVar332,auVar306);
                auVar306 = vsubps_avx(auVar300,auVar306);
                auVar316 = vfnmadd231ps_fma(auVar301,auVar306,auVar375);
                auVar385 = ZEXT3264(auVar332);
                auVar301 = ZEXT1632(auVar316);
                fVar11 = auVar316._0_4_;
                fVar12 = auVar316._4_4_;
                fVar13 = auVar316._8_4_;
                fVar14 = auVar316._12_4_;
                auVar23._28_4_ = auVar300._28_4_;
                auVar23._0_28_ =
                     ZEXT1628(CONCAT412(fVar14 * fVar14,
                                        CONCAT48(fVar13 * fVar13,
                                                 CONCAT44(fVar12 * fVar12,fVar11 * fVar11))));
                auVar353._8_4_ = 0x3ab743ce;
                auVar353._0_8_ = 0x3ab743ce3ab743ce;
                auVar353._12_4_ = 0x3ab743ce;
                auVar353._16_4_ = 0x3ab743ce;
                auVar353._20_4_ = 0x3ab743ce;
                auVar353._24_4_ = 0x3ab743ce;
                auVar353._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar382,auVar301,auVar353);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar301,auVar390);
                auVar354._8_4_ = 0x3d2aa9c1;
                auVar354._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar354._12_4_ = 0x3d2aa9c1;
                auVar354._16_4_ = 0x3d2aa9c1;
                auVar354._20_4_ = 0x3d2aa9c1;
                auVar354._24_4_ = 0x3d2aa9c1;
                auVar354._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar301,auVar354);
                auVar355._8_4_ = 0x3e2aaaaa;
                auVar355._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar355._12_4_ = 0x3e2aaaaa;
                auVar355._16_4_ = 0x3e2aaaaa;
                auVar355._20_4_ = 0x3e2aaaaa;
                auVar355._24_4_ = 0x3e2aaaaa;
                auVar355._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar355);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar277);
                auVar243._0_4_ = fVar11 + fVar59;
                auVar243._4_4_ = fVar12 + fVar356;
                auVar243._8_4_ = fVar13 + fVar357;
                auVar243._12_4_ = fVar14 + fVar358;
                auVar243._16_4_ = fVar217 + 0.0;
                auVar243._20_4_ = fVar359 + 0.0;
                auVar243._24_4_ = fVar360 + 0.0;
                auVar243._28_4_ = fVar361 + 0.0;
                auVar321 = vfmadd231ps_fma(auVar243,auVar23,ZEXT1632(auVar321));
                auVar271._0_4_ = (int)auVar306._0_4_;
                auVar271._4_4_ = (int)auVar306._4_4_;
                auVar271._8_4_ = (int)auVar306._8_4_;
                auVar271._12_4_ = (int)auVar306._12_4_;
                auVar271._16_4_ = (int)auVar306._16_4_;
                auVar271._20_4_ = (int)auVar306._20_4_;
                auVar271._24_4_ = (int)auVar306._24_4_;
                auVar271._28_4_ = (int)auVar306._28_4_;
                auVar306 = vpslld_avx2(auVar271,0x17);
                auVar306 = vpaddd_avx2(auVar306,auVar164);
                auVar377 = ZEXT1664((undefined1  [16])0x0);
                auVar321 = vfmadd213ps_fma(auVar306,ZEXT1632(auVar321),auVar332);
                auVar306 = vrcpps_avx(ZEXT1632(auVar321));
                auVar321 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar306,auVar332);
                auVar321 = vfnmadd132ps_fma(ZEXT1632(auVar321),auVar306,auVar306);
                auVar321 = vfnmadd213ps_fma(ZEXT1632(auVar321),auVar127,auVar210);
                auVar155 = ZEXT1628(auVar321);
                goto LAB_0030fd04;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar168._4_4_ = uVar1;
                auVar168._0_4_ = uVar1;
                auVar168._8_4_ = uVar1;
                auVar168._12_4_ = uVar1;
                auVar168._16_4_ = uVar1;
                auVar168._20_4_ = uVar1;
                auVar168._24_4_ = uVar1;
                auVar168._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar245._4_4_ = uVar1;
                auVar245._0_4_ = uVar1;
                auVar245._8_4_ = uVar1;
                auVar245._12_4_ = uVar1;
                auVar245._16_4_ = uVar1;
                auVar245._20_4_ = uVar1;
                auVar245._24_4_ = uVar1;
                auVar245._28_4_ = uVar1;
                auVar321 = vfmadd231ps_fma(auVar245,auVar306,auVar168);
                auVar306 = vmaxps_avx(ZEXT1632(auVar321),auVar301);
                auVar306 = vminps_avx(auVar306,auVar332);
                auVar155 = auVar306._0_28_;
LAB_0030fd04:
                auVar460._0_4_ = auVar459._0_4_ * auVar155._0_4_;
                auVar460._4_4_ = auVar459._4_4_ * auVar155._4_4_;
                auVar460._8_4_ = auVar459._8_4_ * auVar155._8_4_;
                auVar460._12_4_ = auVar459._12_4_ * auVar155._12_4_;
                auVar460._16_4_ = auVar459._16_4_ * auVar155._16_4_;
                auVar460._20_4_ = auVar459._20_4_ * auVar155._20_4_;
                auVar460._24_4_ = auVar459._24_4_ * auVar155._24_4_;
                auVar306 = auVar460._0_32_;
              }
              *pauVar47 = auVar306;
              pauVar47 = pauVar47 + 1;
              bVar58 = iVar54 != iVar3;
              iVar54 = iVar54 + 1;
            } while (bVar58);
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != _h);
      }
      if ((uVar35 == 0 && uVar2 == 4) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_148 = 0;
        auVar377 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar278._8_4_ = 0x3f000000;
        auVar278._0_8_ = 0x3f0000003f000000;
        auVar278._12_4_ = 0x3f000000;
        auVar278._16_4_ = 0x3f000000;
        auVar278._20_4_ = 0x3f000000;
        auVar278._24_4_ = 0x3f000000;
        auVar278._28_4_ = 0x3f000000;
        auVar285._8_4_ = 0x3f800000;
        auVar285._0_8_ = 0x3f8000003f800000;
        auVar285._12_4_ = 0x3f800000;
        auVar285._16_4_ = 0x3f800000;
        auVar285._20_4_ = 0x3f800000;
        auVar285._24_4_ = 0x3f800000;
        auVar285._28_4_ = 0x3f800000;
        auVar370._8_4_ = 0xc2b0c0a5;
        auVar370._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar370._12_4_ = 0xc2b0c0a5;
        auVar370._16_4_ = 0xc2b0c0a5;
        auVar370._20_4_ = 0xc2b0c0a5;
        auVar370._24_4_ = 0xc2b0c0a5;
        auVar370._28_4_ = 0xc2b0c0a5;
        auVar391._8_4_ = 0x3d2aa9c1;
        auVar391._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar391._12_4_ = 0x3d2aa9c1;
        auVar391._16_4_ = 0x3d2aa9c1;
        auVar391._20_4_ = 0x3d2aa9c1;
        auVar391._24_4_ = 0x3d2aa9c1;
        auVar391._28_4_ = 0x3d2aa9c1;
        do {
          if (-1 < iVar3) {
            pauVar47 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_148 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar54 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar385 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar385 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_148 * 0x20));
              }
              if (iVar32 < 1) {
                auVar175 = ZEXT3264(auVar385._0_32_);
              }
              else {
                pauVar55 = (undefined1 (*) [32])
                           ((this->weight_data_packed).cstep * local_148 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                puVar42 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar52) * 4 + 4);
                uVar48 = 0;
                do {
                  if (*(int *)(&this->field_0xd4 + (long)p_Var4) < 1) {
                    auVar175 = ZEXT3264(auVar385._0_32_);
                  }
                  else {
                    puVar36 = puVar42;
                    iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      uVar1 = puVar36[-3];
                      auVar457._4_4_ = uVar1;
                      auVar457._0_4_ = uVar1;
                      auVar457._8_4_ = uVar1;
                      auVar457._12_4_ = uVar1;
                      auVar457._16_4_ = uVar1;
                      auVar457._20_4_ = uVar1;
                      auVar457._24_4_ = uVar1;
                      auVar457._28_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar246._4_4_ = uVar1;
                      auVar246._0_4_ = uVar1;
                      auVar246._8_4_ = uVar1;
                      auVar246._12_4_ = uVar1;
                      auVar246._16_4_ = uVar1;
                      auVar246._20_4_ = uVar1;
                      auVar246._24_4_ = uVar1;
                      auVar246._28_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar272._4_4_ = uVar1;
                      auVar272._0_4_ = uVar1;
                      auVar272._8_4_ = uVar1;
                      auVar272._12_4_ = uVar1;
                      auVar272._16_4_ = uVar1;
                      auVar272._20_4_ = uVar1;
                      auVar272._24_4_ = uVar1;
                      auVar272._28_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar310._4_4_ = uVar1;
                      auVar310._0_4_ = uVar1;
                      auVar310._8_4_ = uVar1;
                      auVar310._12_4_ = uVar1;
                      auVar310._16_4_ = uVar1;
                      auVar310._20_4_ = uVar1;
                      auVar310._24_4_ = uVar1;
                      auVar310._28_4_ = uVar1;
                      auVar321 = vfmadd132ps_fma(auVar457,auVar385._0_32_,*pauVar55);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar246,pauVar55[1]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar272,pauVar55[2]);
                      auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar310,pauVar55[3]);
                      auVar175 = ZEXT1664(auVar321);
                      pauVar55 = pauVar55 + 4;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      auVar385 = ZEXT1664(auVar321);
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar48 = uVar48 + 1;
                  puVar42 = (undefined4 *)((long)puVar42 + (long)local_b8.w * local_b8.elemsize);
                  auVar385 = ZEXT3264(auVar175._0_32_);
                } while (uVar48 != uVar53);
              }
              auVar306 = auVar175._0_32_;
              p_Var4 = pp_Var5[-3];
              auVar301 = auVar377._0_32_;
              auVar385._28_36_ = auVar175._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar306 = vmaxps_avx(auVar306,_DAT_00320640);
                break;
              case 2:
                auVar301 = vmaxps_avx(auVar306,ZEXT1632(ZEXT816(0) << 0x40));
                auVar306 = vminps_avx(auVar306,ZEXT1632(ZEXT816(0) << 0x40));
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar458._4_4_ = uVar1;
                auVar458._0_4_ = uVar1;
                auVar458._8_4_ = uVar1;
                auVar458._12_4_ = uVar1;
                auVar458._16_4_ = uVar1;
                auVar458._20_4_ = uVar1;
                auVar458._24_4_ = uVar1;
                auVar458._28_4_ = uVar1;
                auVar321 = vfmadd213ps_fma(auVar458,auVar306,auVar301);
                auVar306 = ZEXT1632(auVar321);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar171._4_4_ = uVar1;
                auVar171._0_4_ = uVar1;
                auVar171._8_4_ = uVar1;
                auVar171._12_4_ = uVar1;
                auVar171._16_4_ = uVar1;
                auVar171._20_4_ = uVar1;
                auVar171._24_4_ = uVar1;
                auVar171._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar312._4_4_ = uVar1;
                auVar312._0_4_ = uVar1;
                auVar312._8_4_ = uVar1;
                auVar312._12_4_ = uVar1;
                auVar312._16_4_ = uVar1;
                auVar312._20_4_ = uVar1;
                auVar312._24_4_ = uVar1;
                auVar312._28_4_ = uVar1;
                auVar306 = vmaxps_avx(auVar306,auVar171);
                auVar306 = vminps_avx(auVar306,auVar312);
                break;
              case 4:
                auVar172._0_8_ = auVar175._0_8_ ^ 0x8000000080000000;
                auVar172._8_4_ = -auVar175._8_4_;
                auVar172._12_4_ = -auVar175._12_4_;
                auVar172._16_4_ = -auVar175._16_4_;
                auVar172._20_4_ = -auVar175._20_4_;
                auVar172._24_4_ = -auVar175._24_4_;
                auVar172._28_4_ = auVar175._28_4_ ^ 0x80000000;
                auVar134._8_4_ = 0x42b0c0a5;
                auVar134._0_8_ = 0x42b0c0a542b0c0a5;
                auVar134._12_4_ = 0x42b0c0a5;
                auVar134._16_4_ = 0x42b0c0a5;
                auVar134._20_4_ = 0x42b0c0a5;
                auVar134._24_4_ = 0x42b0c0a5;
                auVar134._28_4_ = 0x42b0c0a5;
                auVar306 = vminps_avx(auVar172,auVar134);
                auVar135._8_4_ = 0xc2b0c0a5;
                auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar135._12_4_ = 0xc2b0c0a5;
                auVar135._16_4_ = 0xc2b0c0a5;
                auVar135._20_4_ = 0xc2b0c0a5;
                auVar135._24_4_ = 0xc2b0c0a5;
                auVar135._28_4_ = 0xc2b0c0a5;
                auVar332 = vmaxps_avx(auVar306,auVar135);
                auVar321 = vfmadd213ps_fma(auVar301,auVar332,auVar278);
                auVar301 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar306 = vcmpps_avx(ZEXT1632(auVar321),auVar301,1);
                auVar306 = vandps_avx(auVar306,auVar285);
                auVar306 = vsubps_avx(auVar301,auVar306);
                auVar251._8_4_ = 0xbf317218;
                auVar251._0_8_ = 0xbf317218bf317218;
                auVar251._12_4_ = 0xbf317218;
                auVar251._16_4_ = 0xbf317218;
                auVar251._20_4_ = 0xbf317218;
                auVar251._24_4_ = 0xbf317218;
                auVar251._28_4_ = 0xbf317218;
                auVar316 = vfmadd231ps_fma(auVar332,auVar306,auVar251);
                auVar332 = ZEXT1632(auVar316);
                fVar59 = auVar316._0_4_;
                fVar356 = auVar316._4_4_;
                fVar357 = auVar316._8_4_;
                fVar358 = auVar316._12_4_;
                auVar29._28_4_ = auVar301._28_4_;
                auVar29._0_28_ =
                     ZEXT1628(CONCAT412(fVar358 * fVar358,
                                        CONCAT48(fVar357 * fVar357,
                                                 CONCAT44(fVar356 * fVar356,fVar59 * fVar59))));
                auVar341._8_4_ = 0x39506967;
                auVar341._0_8_ = 0x3950696739506967;
                auVar341._12_4_ = 0x39506967;
                auVar341._16_4_ = 0x39506967;
                auVar341._20_4_ = 0x39506967;
                auVar341._24_4_ = 0x39506967;
                auVar341._28_4_ = 0x39506967;
                auVar252._8_4_ = 0x3ab743ce;
                auVar252._0_8_ = 0x3ab743ce3ab743ce;
                auVar252._12_4_ = 0x3ab743ce;
                auVar252._16_4_ = 0x3ab743ce;
                auVar252._20_4_ = 0x3ab743ce;
                auVar252._24_4_ = 0x3ab743ce;
                auVar252._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar341,auVar332,auVar252);
                auVar216._8_4_ = 0x3c088908;
                auVar216._0_8_ = 0x3c0889083c088908;
                auVar216._12_4_ = 0x3c088908;
                auVar216._16_4_ = 0x3c088908;
                auVar216._20_4_ = 0x3c088908;
                auVar216._24_4_ = 0x3c088908;
                auVar216._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar216);
                auVar136._8_4_ = 0x3d2aa9c1;
                auVar136._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar136._12_4_ = 0x3d2aa9c1;
                auVar136._16_4_ = 0x3d2aa9c1;
                auVar136._20_4_ = 0x3d2aa9c1;
                auVar136._24_4_ = 0x3d2aa9c1;
                auVar136._28_4_ = 0x3d2aa9c1;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar136);
                auVar137._8_4_ = 0x3e2aaaaa;
                auVar137._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar137._12_4_ = 0x3e2aaaaa;
                auVar137._16_4_ = 0x3e2aaaaa;
                auVar137._20_4_ = 0x3e2aaaaa;
                auVar137._24_4_ = 0x3e2aaaaa;
                auVar137._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar137);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar278);
                auVar173._0_4_ = fVar59 + 1.0;
                auVar173._4_4_ = fVar356 + 1.0;
                auVar173._8_4_ = fVar357 + 1.0;
                auVar173._12_4_ = fVar358 + 1.0;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar321 = vfmadd231ps_fma(auVar173,auVar29,ZEXT1632(auVar321));
                auVar313._0_4_ = (int)auVar306._0_4_;
                auVar313._4_4_ = (int)auVar306._4_4_;
                auVar313._8_4_ = (int)auVar306._8_4_;
                auVar313._12_4_ = (int)auVar306._12_4_;
                auVar313._16_4_ = (int)auVar306._16_4_;
                auVar313._20_4_ = (int)auVar306._20_4_;
                auVar313._24_4_ = (int)auVar306._24_4_;
                auVar313._28_4_ = (int)auVar306._28_4_;
                auVar306 = vpslld_avx2(auVar313,0x17);
                auVar342._8_4_ = 0x3f800000;
                auVar342._0_8_ = 0x3f8000003f800000;
                auVar342._12_4_ = 0x3f800000;
                auVar342._16_4_ = 0x3f800000;
                auVar342._20_4_ = 0x3f800000;
                auVar342._24_4_ = 0x3f800000;
                auVar342._28_4_ = 0x3f800000;
                auVar306 = vpaddd_avx2(auVar342,auVar306);
                auVar321 = vfmadd213ps_fma(auVar306,ZEXT1632(auVar321),auVar285);
                auVar306 = vrcpps_avx(ZEXT1632(auVar321));
                auVar321 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar306,auVar285);
                auVar321 = vfnmadd132ps_fma(ZEXT1632(auVar321),auVar306,auVar306);
                auVar306 = ZEXT1632(auVar321);
                break;
              case 5:
                auVar213._8_4_ = 0x42b0c0a5;
                auVar213._0_8_ = 0x42b0c0a542b0c0a5;
                auVar213._12_4_ = 0x42b0c0a5;
                auVar213._16_4_ = 0x42b0c0a5;
                auVar213._20_4_ = 0x42b0c0a5;
                auVar213._24_4_ = 0x42b0c0a5;
                auVar213._28_4_ = 0x42b0c0a5;
                auVar306 = vminps_avx(auVar306,auVar213);
                auVar332 = vmaxps_avx(auVar370,auVar306);
                auVar321 = vfmadd213ps_fma(auVar301,auVar332,auVar278);
                auVar300 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar306 = vcmpps_avx(ZEXT1632(auVar321),auVar300,1);
                auVar306 = vandps_avx(auVar306,auVar285);
                auVar306 = vsubps_avx(auVar300,auVar306);
                auVar131._8_4_ = 0x3f317218;
                auVar131._0_8_ = 0x3f3172183f317218;
                auVar131._12_4_ = 0x3f317218;
                auVar131._16_4_ = 0x3f317218;
                auVar131._20_4_ = 0x3f317218;
                auVar131._24_4_ = 0x3f317218;
                auVar131._28_4_ = 0x3f317218;
                auVar316 = vfnmadd231ps_fma(auVar332,auVar306,auVar131);
                auVar332 = ZEXT1632(auVar316);
                fVar59 = auVar316._0_4_;
                fVar356 = auVar316._4_4_;
                fVar357 = auVar316._8_4_;
                fVar358 = auVar316._12_4_;
                auVar25._28_4_ = auVar300._28_4_;
                auVar25._0_28_ =
                     ZEXT1628(CONCAT412(fVar358 * fVar358,
                                        CONCAT48(fVar357 * fVar357,
                                                 CONCAT44(fVar356 * fVar356,fVar59 * fVar59))));
                auVar411._8_4_ = 0x39506967;
                auVar411._0_8_ = 0x3950696739506967;
                auVar411._12_4_ = 0x39506967;
                auVar411._16_4_ = 0x39506967;
                auVar411._20_4_ = 0x39506967;
                auVar411._24_4_ = 0x39506967;
                auVar411._28_4_ = 0x39506967;
                auVar383._8_4_ = 0x3ab743ce;
                auVar383._0_8_ = 0x3ab743ce3ab743ce;
                auVar383._12_4_ = 0x3ab743ce;
                auVar383._16_4_ = 0x3ab743ce;
                auVar383._20_4_ = 0x3ab743ce;
                auVar383._24_4_ = 0x3ab743ce;
                auVar383._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar411,auVar332,auVar383);
                auVar214._8_4_ = 0x3c088908;
                auVar214._0_8_ = 0x3c0889083c088908;
                auVar214._12_4_ = 0x3c088908;
                auVar214._16_4_ = 0x3c088908;
                auVar214._20_4_ = 0x3c088908;
                auVar214._24_4_ = 0x3c088908;
                auVar214._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar214);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar391);
                auVar384._8_4_ = 0x3e2aaaaa;
                auVar384._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar384._12_4_ = 0x3e2aaaaa;
                auVar384._16_4_ = 0x3e2aaaaa;
                auVar384._20_4_ = 0x3e2aaaaa;
                auVar384._24_4_ = 0x3e2aaaaa;
                auVar384._28_4_ = 0x3e2aaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar384);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar278);
                auVar247._0_4_ = fVar59 + 1.0;
                auVar247._4_4_ = fVar356 + 1.0;
                auVar247._8_4_ = fVar357 + 1.0;
                auVar247._12_4_ = fVar358 + 1.0;
                auVar247._16_4_ = 0x3f800000;
                auVar247._20_4_ = 0x3f800000;
                auVar247._24_4_ = 0x3f800000;
                auVar247._28_4_ = 0x3f800000;
                auVar321 = vfmadd231ps_fma(auVar247,auVar25,ZEXT1632(auVar321));
                auVar169._0_4_ = (int)auVar306._0_4_;
                auVar169._4_4_ = (int)auVar306._4_4_;
                auVar169._8_4_ = (int)auVar306._8_4_;
                auVar169._12_4_ = (int)auVar306._12_4_;
                auVar169._16_4_ = (int)auVar306._16_4_;
                auVar169._20_4_ = (int)auVar306._20_4_;
                auVar169._24_4_ = (int)auVar306._24_4_;
                auVar169._28_4_ = (int)auVar306._28_4_;
                auVar306 = vpslld_avx2(auVar169,0x17);
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar306 = vpaddd_avx2(auVar306,auVar170);
                auVar321 = vfmadd213ps_fma(auVar306,ZEXT1632(auVar321),auVar285);
                auVar248._8_4_ = 0x800000;
                auVar248._0_8_ = 0x80000000800000;
                auVar248._12_4_ = 0x800000;
                auVar248._16_4_ = 0x800000;
                auVar248._20_4_ = 0x800000;
                auVar248._24_4_ = 0x800000;
                auVar248._28_4_ = 0x800000;
                auVar306 = vmaxps_avx(ZEXT1632(auVar321),auVar248);
                auVar332 = vpsrld_avx2(auVar306,0x17);
                auVar412._8_4_ = 0x807fffff;
                auVar412._0_8_ = 0x807fffff807fffff;
                auVar412._12_4_ = 0x807fffff;
                auVar412._16_4_ = 0x807fffff;
                auVar412._20_4_ = 0x807fffff;
                auVar412._24_4_ = 0x807fffff;
                auVar412._28_4_ = 0x807fffff;
                auVar306 = vandps_avx(auVar412,auVar306);
                auVar413._8_4_ = 0x3f000000;
                auVar413._0_8_ = 0x3f0000003f000000;
                auVar413._12_4_ = 0x3f000000;
                auVar413._16_4_ = 0x3f000000;
                auVar413._20_4_ = 0x3f000000;
                auVar413._24_4_ = 0x3f000000;
                auVar413._28_4_ = 0x3f000000;
                auVar300 = vorps_avx(auVar413,auVar306);
                auVar414._8_4_ = 0xffffff82;
                auVar414._0_8_ = 0xffffff82ffffff82;
                auVar414._12_4_ = 0xffffff82;
                auVar414._16_4_ = 0xffffff82;
                auVar414._20_4_ = 0xffffff82;
                auVar414._24_4_ = 0xffffff82;
                auVar414._28_4_ = 0xffffff82;
                auVar331 = vpaddd_avx2(auVar332,auVar414);
                auVar273._8_4_ = 0x3f3504f3;
                auVar273._0_8_ = 0x3f3504f33f3504f3;
                auVar273._12_4_ = 0x3f3504f3;
                auVar273._16_4_ = 0x3f3504f3;
                auVar273._20_4_ = 0x3f3504f3;
                auVar273._24_4_ = 0x3f3504f3;
                auVar273._28_4_ = 0x3f3504f3;
                auVar332 = vcmpps_avx(auVar300,auVar273,1);
                auVar306 = vandps_avx(auVar332,auVar300);
                auVar215._8_4_ = 0xbf800000;
                auVar215._0_8_ = 0xbf800000bf800000;
                auVar215._12_4_ = 0xbf800000;
                auVar215._16_4_ = 0xbf800000;
                auVar215._20_4_ = 0xbf800000;
                auVar215._24_4_ = 0xbf800000;
                auVar215._28_4_ = 0xbf800000;
                auVar249._0_4_ = auVar300._0_4_ + -1.0 + auVar306._0_4_;
                auVar249._4_4_ = auVar300._4_4_ + -1.0 + auVar306._4_4_;
                auVar249._8_4_ = auVar300._8_4_ + -1.0 + auVar306._8_4_;
                auVar249._12_4_ = auVar300._12_4_ + -1.0 + auVar306._12_4_;
                auVar249._16_4_ = auVar300._16_4_ + -1.0 + auVar306._16_4_;
                auVar249._20_4_ = auVar300._20_4_ + -1.0 + auVar306._20_4_;
                auVar249._24_4_ = auVar300._24_4_ + -1.0 + auVar306._24_4_;
                auVar249._28_4_ = auVar300._28_4_ + -1.0 + auVar306._28_4_;
                auVar300 = vcmpps_avx(ZEXT1632(auVar321),_DAT_00320640,2);
                auVar331 = vcvtdq2ps_avx(auVar331);
                auVar306 = vandps_avx(auVar332,auVar285);
                auVar306 = vsubps_avx(auVar331,auVar306);
                auVar339._8_4_ = 0x3d9021bb;
                auVar339._0_8_ = 0x3d9021bb3d9021bb;
                auVar339._12_4_ = 0x3d9021bb;
                auVar339._16_4_ = 0x3d9021bb;
                auVar339._20_4_ = 0x3d9021bb;
                auVar339._24_4_ = 0x3d9021bb;
                auVar339._28_4_ = 0x3d9021bb;
                auVar415._8_4_ = 0xbdebd1b8;
                auVar415._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar415._12_4_ = 0xbdebd1b8;
                auVar415._16_4_ = 0xbdebd1b8;
                auVar415._20_4_ = 0xbdebd1b8;
                auVar415._24_4_ = 0xbdebd1b8;
                auVar415._28_4_ = 0xbdebd1b8;
                auVar321 = vfmadd213ps_fma(auVar339,auVar249,auVar415);
                auVar416._8_4_ = 0x3def251a;
                auVar416._0_8_ = 0x3def251a3def251a;
                auVar416._12_4_ = 0x3def251a;
                auVar416._16_4_ = 0x3def251a;
                auVar416._20_4_ = 0x3def251a;
                auVar416._24_4_ = 0x3def251a;
                auVar416._28_4_ = 0x3def251a;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar416);
                auVar417._8_4_ = 0xbdfe5d4f;
                auVar417._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar417._12_4_ = 0xbdfe5d4f;
                auVar417._16_4_ = 0xbdfe5d4f;
                auVar417._20_4_ = 0xbdfe5d4f;
                auVar417._24_4_ = 0xbdfe5d4f;
                auVar417._28_4_ = 0xbdfe5d4f;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar417);
                auVar418._8_4_ = 0x3e11e9bf;
                auVar418._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar418._12_4_ = 0x3e11e9bf;
                auVar418._16_4_ = 0x3e11e9bf;
                auVar418._20_4_ = 0x3e11e9bf;
                auVar418._24_4_ = 0x3e11e9bf;
                auVar418._28_4_ = 0x3e11e9bf;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar418);
                auVar419._8_4_ = 0xbe2aae50;
                auVar419._0_8_ = 0xbe2aae50be2aae50;
                auVar419._12_4_ = 0xbe2aae50;
                auVar419._16_4_ = 0xbe2aae50;
                auVar419._20_4_ = 0xbe2aae50;
                auVar419._24_4_ = 0xbe2aae50;
                auVar419._28_4_ = 0xbe2aae50;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar419);
                auVar420._8_4_ = 0x3e4cceac;
                auVar420._0_8_ = 0x3e4cceac3e4cceac;
                auVar420._12_4_ = 0x3e4cceac;
                auVar420._16_4_ = 0x3e4cceac;
                auVar420._20_4_ = 0x3e4cceac;
                auVar420._24_4_ = 0x3e4cceac;
                auVar420._28_4_ = 0x3e4cceac;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar420);
                auVar421._8_4_ = 0xbe7ffffc;
                auVar421._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar421._12_4_ = 0xbe7ffffc;
                auVar421._16_4_ = 0xbe7ffffc;
                auVar421._20_4_ = 0xbe7ffffc;
                auVar421._24_4_ = 0xbe7ffffc;
                auVar421._28_4_ = 0xbe7ffffc;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar421);
                auVar422._8_4_ = 0x3eaaaaaa;
                auVar422._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar422._12_4_ = 0x3eaaaaaa;
                auVar422._16_4_ = 0x3eaaaaaa;
                auVar422._20_4_ = 0x3eaaaaaa;
                auVar422._24_4_ = 0x3eaaaaaa;
                auVar422._28_4_ = 0x3eaaaaaa;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar249,auVar422);
                auVar316 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar249,auVar278);
                auVar376._8_4_ = 0x3f317218;
                auVar376._0_8_ = 0x3f3172183f317218;
                auVar376._12_4_ = 0x3f317218;
                auVar376._16_4_ = 0x3f317218;
                auVar376._20_4_ = 0x3f317218;
                auVar376._24_4_ = 0x3f317218;
                auVar376._28_4_ = 0x3f317218;
                auVar321 = vfmadd213ps_fma(auVar306,auVar376,auVar249);
                auVar26._4_4_ = auVar249._4_4_ * auVar249._4_4_;
                auVar26._0_4_ = auVar249._0_4_ * auVar249._0_4_;
                auVar26._8_4_ = auVar249._8_4_ * auVar249._8_4_;
                auVar26._12_4_ = auVar249._12_4_ * auVar249._12_4_;
                auVar26._16_4_ = auVar249._16_4_ * auVar249._16_4_;
                auVar26._20_4_ = auVar249._20_4_ * auVar249._20_4_;
                auVar26._24_4_ = auVar249._24_4_ * auVar249._24_4_;
                auVar26._28_4_ = auVar249._28_4_;
                auVar321 = vfmadd231ps_fma(ZEXT1632(auVar321),auVar26,ZEXT1632(auVar316));
                auVar423._8_4_ = 0xc0000000;
                auVar423._0_8_ = 0xc0000000c0000000;
                auVar423._12_4_ = 0xc0000000;
                auVar423._16_4_ = 0xc0000000;
                auVar423._20_4_ = 0xc0000000;
                auVar423._24_4_ = 0xc0000000;
                auVar423._28_4_ = 0xc0000000;
                auVar27._4_4_ = auVar321._4_4_ * -2.0;
                auVar27._0_4_ = auVar321._0_4_ * -2.0;
                auVar27._8_4_ = auVar321._8_4_ * -2.0;
                auVar27._12_4_ = auVar321._12_4_ * -2.0;
                auVar27._16_4_ = 0x80000000;
                auVar27._20_4_ = 0x80000000;
                auVar27._24_4_ = 0x80000000;
                auVar27._28_4_ = auVar249._28_4_;
                auVar311._8_4_ = 0x7fffffff;
                auVar311._0_8_ = 0x7fffffff7fffffff;
                auVar311._12_4_ = 0x7fffffff;
                auVar311._16_4_ = 0x7fffffff;
                auVar311._20_4_ = 0x7fffffff;
                auVar311._24_4_ = 0x7fffffff;
                auVar311._28_4_ = 0x7fffffff;
                auVar306 = vblendvps_avx(auVar27,auVar311,auVar300);
                auVar306 = vminps_avx(auVar213,auVar306);
                auVar332 = vmaxps_avx(auVar370,auVar306);
                auVar377 = ZEXT3264(auVar301);
                auVar321 = vfmadd213ps_fma(auVar301,auVar332,auVar278);
                auVar301 = vroundps_avx(ZEXT1632(auVar321),1);
                auVar306 = vcmpps_avx(ZEXT1632(auVar321),auVar301,1);
                auVar306 = vandps_avx(auVar306,auVar285);
                auVar306 = vsubps_avx(auVar301,auVar306);
                auVar316 = vfnmadd231ps_fma(auVar332,auVar306,auVar376);
                auVar332 = ZEXT1632(auVar316);
                fVar59 = auVar316._0_4_;
                fVar356 = auVar316._4_4_;
                fVar357 = auVar316._8_4_;
                fVar358 = auVar316._12_4_;
                auVar28._28_4_ = auVar301._28_4_;
                auVar28._0_28_ =
                     ZEXT1628(CONCAT412(fVar358 * fVar358,
                                        CONCAT48(fVar357 * fVar357,
                                                 CONCAT44(fVar356 * fVar356,fVar59 * fVar59))));
                auVar340._8_4_ = 0x39506967;
                auVar340._0_8_ = 0x3950696739506967;
                auVar340._12_4_ = 0x39506967;
                auVar340._16_4_ = 0x39506967;
                auVar340._20_4_ = 0x39506967;
                auVar340._24_4_ = 0x39506967;
                auVar340._28_4_ = 0x39506967;
                auVar132._8_4_ = 0x3ab743ce;
                auVar132._0_8_ = 0x3ab743ce3ab743ce;
                auVar132._12_4_ = 0x3ab743ce;
                auVar132._16_4_ = 0x3ab743ce;
                auVar132._20_4_ = 0x3ab743ce;
                auVar132._24_4_ = 0x3ab743ce;
                auVar132._28_4_ = 0x3ab743ce;
                auVar321 = vfmadd213ps_fma(auVar340,auVar332,auVar132);
                auVar133._8_4_ = 0x3c088908;
                auVar133._0_8_ = 0x3c0889083c088908;
                auVar133._12_4_ = 0x3c088908;
                auVar133._16_4_ = 0x3c088908;
                auVar133._20_4_ = 0x3c088908;
                auVar133._24_4_ = 0x3c088908;
                auVar133._28_4_ = 0x3c088908;
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar133);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),auVar332,auVar391);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar384);
                auVar321 = vfmadd213ps_fma(ZEXT1632(auVar321),ZEXT1632(auVar316),auVar278);
                auVar250._0_4_ = fVar59 + 1.0;
                auVar250._4_4_ = fVar356 + 1.0;
                auVar250._8_4_ = fVar357 + 1.0;
                auVar250._12_4_ = fVar358 + 1.0;
                auVar250._16_4_ = 0x3f800000;
                auVar250._20_4_ = 0x3f800000;
                auVar250._24_4_ = 0x3f800000;
                auVar250._28_4_ = 0x3f800000;
                auVar321 = vfmadd231ps_fma(auVar250,auVar28,ZEXT1632(auVar321));
                auVar274._0_4_ = (int)auVar306._0_4_;
                auVar274._4_4_ = (int)auVar306._4_4_;
                auVar274._8_4_ = (int)auVar306._8_4_;
                auVar274._12_4_ = (int)auVar306._12_4_;
                auVar274._16_4_ = (int)auVar306._16_4_;
                auVar274._20_4_ = (int)auVar306._20_4_;
                auVar274._24_4_ = (int)auVar306._24_4_;
                auVar274._28_4_ = (int)auVar306._28_4_;
                auVar306 = vpslld_avx2(auVar274,0x17);
                auVar306 = vpaddd_avx2(auVar306,auVar170);
                auVar321 = vfmadd213ps_fma(auVar306,ZEXT1632(auVar321),auVar285);
                auVar306 = vrcpps_avx(ZEXT1632(auVar321));
                auVar321 = vfmsub213ps_fma(ZEXT1632(auVar321),auVar306,auVar285);
                auVar321 = vfnmadd132ps_fma(ZEXT1632(auVar321),auVar306,auVar306);
                auVar321 = vfnmadd213ps_fma(ZEXT1632(auVar321),auVar423,auVar215);
                auVar155 = ZEXT1628(auVar321);
                goto LAB_003102a7;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar174._4_4_ = uVar1;
                auVar174._0_4_ = uVar1;
                auVar174._8_4_ = uVar1;
                auVar174._12_4_ = uVar1;
                auVar174._16_4_ = uVar1;
                auVar174._20_4_ = uVar1;
                auVar174._24_4_ = uVar1;
                auVar174._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar253._4_4_ = uVar1;
                auVar253._0_4_ = uVar1;
                auVar253._8_4_ = uVar1;
                auVar253._12_4_ = uVar1;
                auVar253._16_4_ = uVar1;
                auVar253._20_4_ = uVar1;
                auVar253._24_4_ = uVar1;
                auVar253._28_4_ = uVar1;
                auVar321 = vfmadd231ps_fma(auVar253,auVar306,auVar174);
                auVar306 = vmaxps_avx(ZEXT1632(auVar321),_DAT_00320640);
                auVar306 = vminps_avx(auVar306,auVar285);
                auVar155 = auVar306._0_28_;
LAB_003102a7:
                auVar385._0_4_ = auVar175._0_4_ * auVar155._0_4_;
                auVar385._4_4_ = auVar175._4_4_ * auVar155._4_4_;
                auVar385._8_4_ = auVar175._8_4_ * auVar155._8_4_;
                auVar385._12_4_ = auVar175._12_4_ * auVar155._12_4_;
                auVar385._16_4_ = auVar175._16_4_ * auVar155._16_4_;
                auVar385._20_4_ = auVar175._20_4_ * auVar155._20_4_;
                auVar385._24_4_ = auVar175._24_4_ * auVar155._24_4_;
                auVar306 = auVar385._0_32_;
              }
              *pauVar47 = auVar306;
              pauVar47 = pauVar47 + 1;
              iVar52 = iVar52 + 4;
              bVar58 = iVar54 != iVar3;
              iVar54 = iVar54 + 1;
            } while (bVar58);
          }
          local_148 = local_148 + 1;
        } while (local_148 != _h);
      }
      uVar35 = uVar38 ^ 1;
      if ((uVar35 == 0 && uVar37 == 0) && 0 < (int)_h) {
        local_60 = top_blob->data;
        local_68 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_58 = (ulong)_h;
        uVar48 = 0;
        do {
          pvVar31 = local_60;
          pvVar10 = local_b8.data;
          if (-1 < iVar3) {
            lVar34 = local_68 * uVar48;
            lVar57 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            sVar7 = (this->weight_data_packed).cstep;
            sVar8 = (this->weight_data_packed).elemsize;
            pvVar9 = (this->weight_data_packed).data;
            iVar54 = 0;
            uVar39 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                fVar59 = 0.0;
              }
              else {
                fVar59 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + uVar48 * 4);
              }
              if (iVar32 < 1) {
                auVar306 = SUB6432(ZEXT864(0),0);
              }
              else {
                p_Var4 = pp_Var6[-3];
                pauVar47 = (undefined1 (*) [32])
                           ((long)(_func_int ***)pvVar10 +
                           (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar54) * 4);
                auVar377 = ZEXT864(0);
                uVar43 = 0;
                pauVar55 = (undefined1 (*) [32])(sVar7 * uVar48 * sVar8 + (long)pvVar9);
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pauVar49 = pauVar47;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      auVar321 = vfmadd231ps_fma(auVar377._0_32_,*pauVar55,*pauVar49);
                      auVar377 = ZEXT1664(auVar321);
                      pauVar55 = pauVar55 + 1;
                      pauVar49 = (undefined1 (*) [32])
                                 (*pauVar49 +
                                 (long)(*(int *)(&this->field_0xd8 + (long)p_Var4) << 3) * 4);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar306 = auVar377._0_32_;
                  uVar43 = uVar43 + 1;
                  pauVar47 = (undefined1 (*) [32])(*pauVar47 + lVar57);
                } while (uVar43 != uVar53);
              }
              auVar316._0_4_ = auVar306._16_4_ + auVar306._0_4_;
              auVar316._4_4_ = auVar306._20_4_ + auVar306._4_4_;
              auVar316._8_4_ = auVar306._24_4_ + auVar306._8_4_;
              auVar316._12_4_ = auVar306._28_4_ + auVar306._12_4_;
              auVar321 = vshufpd_avx(auVar316,auVar316,1);
              auVar219._0_4_ = auVar321._0_4_ + auVar316._0_4_;
              auVar219._4_4_ = auVar321._4_4_ + auVar316._4_4_;
              auVar219._8_4_ = auVar321._8_4_ + auVar316._8_4_;
              auVar219._12_4_ = auVar321._12_4_ + auVar316._12_4_;
              auVar321 = vmovshdup_avx(auVar219);
              fVar59 = auVar321._0_4_ + fVar59 + auVar219._0_4_;
              p_Var4 = pp_Var5[-3];
              auVar321 = ZEXT416((uint)fVar59);
              fVar356 = fVar59;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar321 = vmaxss_avx(auVar321,ZEXT416(0));
                fVar356 = auVar321._0_4_;
                break;
              case 2:
                auVar60._0_12_ = ZEXT812(0);
                auVar60._12_4_ = 0;
                auVar321 = vcmpss_avx(auVar60,auVar321,1);
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar321 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar176,auVar321);
                fVar356 = auVar321._0_4_ * fVar59;
                break;
              case 3:
                auVar321 = vmaxss_avx(auVar321,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar321 = vminss_avx(auVar321,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar356 = auVar321._0_4_;
                break;
              case 4:
                fVar59 = expf(-fVar59);
                fVar356 = 1.0 / (fVar59 + 1.0);
                break;
              case 5:
                local_48 = auVar321;
                fVar59 = expf(fVar59);
                fVar59 = logf(fVar59 + 1.0);
                fVar59 = tanhf(fVar59);
                fVar356 = fVar59 * (float)local_48._0_4_;
                break;
              case 6:
                fVar357 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar358 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar217 = -fVar358 / fVar357;
                fVar356 = 0.0;
                if ((fVar217 <= fVar59) && (fVar356 = fVar59, fVar59 <= fVar217 + 1.0 / fVar357)) {
                  auVar321 = vfmadd213ss_fma(ZEXT416((uint)fVar357),auVar321,ZEXT416((uint)fVar358))
                  ;
                  fVar356 = auVar321._0_4_ * fVar59;
                }
              }
              *(float *)((long)pvVar31 + uVar39 * 4 + lVar34) = fVar356;
              uVar39 = uVar39 + 1;
              iVar54 = iVar54 + 8;
            } while (uVar39 != local_50);
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != local_58);
      }
      uVar38 = uVar38 ^ 4;
      if ((uVar37 == 0 && uVar38 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_148 = 0;
        auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar321._8_4_ = 0x3f000000;
        auVar321._0_8_ = 0x3f0000003f000000;
        auVar321._12_4_ = 0x3f000000;
        auVar279._8_4_ = 0x3f800000;
        auVar279._0_8_ = 0x3f8000003f800000;
        auVar279._12_4_ = 0x3f800000;
        auVar378._8_4_ = 0x3ab743ce;
        auVar378._0_8_ = 0x3ab743ce3ab743ce;
        auVar378._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar3) {
            pauVar45 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_148 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar54 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar290 = ZEXT816(0) << 0x40;
              }
              else {
                auVar290 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var4) + local_148 * 0x10);
              }
              if (0 < iVar32) {
                pauVar56 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_148 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                puVar42 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 0x18))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar52) * 4 + 4);
                uVar48 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    puVar36 = puVar42;
                    iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      uVar1 = puVar36[-7];
                      auVar286._4_4_ = uVar1;
                      auVar286._0_4_ = uVar1;
                      auVar286._8_4_ = uVar1;
                      auVar286._12_4_ = uVar1;
                      uVar1 = puVar36[-6];
                      auVar177._4_4_ = uVar1;
                      auVar177._0_4_ = uVar1;
                      auVar177._8_4_ = uVar1;
                      auVar177._12_4_ = uVar1;
                      uVar1 = puVar36[-5];
                      auVar218._4_4_ = uVar1;
                      auVar218._0_4_ = uVar1;
                      auVar218._8_4_ = uVar1;
                      auVar218._12_4_ = uVar1;
                      uVar1 = puVar36[-4];
                      auVar254._4_4_ = uVar1;
                      auVar254._0_4_ = uVar1;
                      auVar254._8_4_ = uVar1;
                      auVar254._12_4_ = uVar1;
                      uVar1 = puVar36[-3];
                      auVar314._4_4_ = uVar1;
                      auVar314._0_4_ = uVar1;
                      auVar314._8_4_ = uVar1;
                      auVar314._12_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar425._4_4_ = uVar1;
                      auVar425._0_4_ = uVar1;
                      auVar425._8_4_ = uVar1;
                      auVar425._12_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar343._4_4_ = uVar1;
                      auVar343._0_4_ = uVar1;
                      auVar343._8_4_ = uVar1;
                      auVar343._12_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar362._4_4_ = uVar1;
                      auVar362._0_4_ = uVar1;
                      auVar362._8_4_ = uVar1;
                      auVar362._12_4_ = uVar1;
                      auVar316 = vfmadd132ps_fma(auVar286,auVar290,*pauVar56);
                      auVar316 = vfmadd231ps_fma(auVar316,auVar177,pauVar56[1]);
                      auVar316 = vfmadd231ps_fma(auVar316,auVar218,pauVar56[2]);
                      auVar316 = vfmadd231ps_fma(auVar316,auVar254,pauVar56[3]);
                      auVar316 = vfmadd231ps_fma(auVar316,auVar314,pauVar56[4]);
                      auVar316 = vfmadd231ps_fma(auVar316,auVar425,pauVar56[5]);
                      auVar316 = vfmadd231ps_fma(auVar316,auVar343,pauVar56[6]);
                      auVar290 = vfmadd231ps_fma(auVar316,auVar362,pauVar56[7]);
                      pauVar56 = pauVar56 + 8;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar48 = uVar48 + 1;
                  puVar42 = (undefined4 *)((long)puVar42 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar48 != uVar53);
              }
              p_Var4 = pp_Var5[-3];
              auVar316 = auVar377._0_16_;
              fVar357 = auVar290._4_4_;
              fVar59 = auVar290._8_4_;
              fVar356 = auVar290._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar290 = vmaxps_avx(auVar316,auVar290);
                break;
              case 2:
                auVar219 = vmaxps_avx(auVar316,auVar290);
                auVar316 = vminps_avx(auVar316,auVar290);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar289._4_4_ = uVar1;
                auVar289._0_4_ = uVar1;
                auVar289._8_4_ = uVar1;
                auVar289._12_4_ = uVar1;
                auVar290 = vfmadd213ps_fma(auVar289,auVar316,auVar219);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar395._4_4_ = uVar1;
                auVar395._0_4_ = uVar1;
                auVar395._8_4_ = uVar1;
                auVar395._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar429._4_4_ = uVar1;
                auVar429._0_4_ = uVar1;
                auVar429._8_4_ = uVar1;
                auVar429._12_4_ = uVar1;
                auVar316 = vmaxps_avx(auVar395,auVar290);
                auVar290 = vminps_avx(auVar429,auVar316);
                break;
              case 4:
                auVar287._0_8_ = auVar290._0_8_ ^ 0x8000000080000000;
                auVar287._8_4_ = -fVar59;
                auVar287._12_4_ = -fVar356;
                auVar184._8_4_ = 0x42b0c0a5;
                auVar184._0_8_ = 0x42b0c0a542b0c0a5;
                auVar184._12_4_ = 0x42b0c0a5;
                auVar316 = vminps_avx(auVar287,auVar184);
                auVar185._8_4_ = 0xc2b0c0a5;
                auVar185._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar185._12_4_ = 0xc2b0c0a5;
                auVar60 = vmaxps_avx(auVar316,auVar185);
                auVar396._8_4_ = 0x3fb8aa3b;
                auVar396._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar396._12_4_ = 0x3fb8aa3b;
                auVar316 = vfmadd213ps_fma(auVar396,auVar60,auVar321);
                auVar430._0_4_ = (int)auVar316._0_4_;
                auVar430._4_4_ = (int)auVar316._4_4_;
                auVar430._8_4_ = (int)auVar316._8_4_;
                auVar430._12_4_ = (int)auVar316._12_4_;
                auVar219 = vcvtdq2ps_avx(auVar430);
                auVar316 = vcmpps_avx(auVar316,auVar219,1);
                auVar316 = vandps_avx(auVar316,auVar279);
                auVar316 = vsubps_avx(auVar219,auVar316);
                auVar186._8_4_ = 0xbf317218;
                auVar186._0_8_ = 0xbf317218bf317218;
                auVar186._12_4_ = 0xbf317218;
                auVar60 = vfmadd231ps_fma(auVar60,auVar316,auVar186);
                fVar59 = auVar60._0_4_;
                auVar431._0_4_ = fVar59 * fVar59;
                fVar356 = auVar60._4_4_;
                auVar431._4_4_ = fVar356 * fVar356;
                fVar357 = auVar60._8_4_;
                auVar431._8_4_ = fVar357 * fVar357;
                fVar358 = auVar60._12_4_;
                auVar431._12_4_ = fVar358 * fVar358;
                auVar318._8_4_ = 0x39506967;
                auVar318._0_8_ = 0x3950696739506967;
                auVar318._12_4_ = 0x39506967;
                auVar187._8_4_ = 0x3ab743ce;
                auVar187._0_8_ = 0x3ab743ce3ab743ce;
                auVar187._12_4_ = 0x3ab743ce;
                auVar219 = vfmadd213ps_fma(auVar318,auVar60,auVar187);
                auVar76._8_4_ = 0x3c088908;
                auVar76._0_8_ = 0x3c0889083c088908;
                auVar76._12_4_ = 0x3c088908;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar76);
                auVar77._8_4_ = 0x3d2aa9c1;
                auVar77._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar77._12_4_ = 0x3d2aa9c1;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar77);
                auVar78._8_4_ = 0x3e2aaaaa;
                auVar78._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar78._12_4_ = 0x3e2aaaaa;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar78);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar321);
                auVar188._0_4_ = fVar59 + 1.0;
                auVar188._4_4_ = fVar356 + 1.0;
                auVar188._8_4_ = fVar357 + 1.0;
                auVar188._12_4_ = fVar358 + 1.0;
                auVar219 = vfmadd231ps_fma(auVar188,auVar431,auVar219);
                auVar288._0_4_ = (int)auVar316._0_4_;
                auVar288._4_4_ = (int)auVar316._4_4_;
                auVar288._8_4_ = (int)auVar316._8_4_;
                auVar288._12_4_ = (int)auVar316._12_4_;
                auVar316 = vpslld_avx(auVar288,0x17);
                auVar319._8_4_ = 0x3f800000;
                auVar319._0_8_ = 0x3f8000003f800000;
                auVar319._12_4_ = 0x3f800000;
                auVar316 = vpaddd_avx(auVar319,auVar316);
                auVar219 = vfmadd213ps_fma(auVar316,auVar219,auVar279);
                auVar316 = vrcpps_avx(auVar219);
                auVar219 = vfmsub213ps_fma(auVar219,auVar316,auVar279);
                auVar290 = vfnmadd132ps_fma(auVar219,auVar316,auVar316);
                break;
              case 5:
                auVar344._8_4_ = 0x42b0c0a5;
                auVar344._0_8_ = 0x42b0c0a542b0c0a5;
                auVar344._12_4_ = 0x42b0c0a5;
                auVar316 = vminps_avx(auVar344,auVar290);
                auVar363._8_4_ = 0xc2b0c0a5;
                auVar363._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar363._12_4_ = 0xc2b0c0a5;
                auVar60 = vmaxps_avx(auVar363,auVar316);
                auVar371._8_4_ = 0x3fb8aa3b;
                auVar371._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar371._12_4_ = 0x3fb8aa3b;
                auVar316 = vfmadd213ps_fma(auVar371,auVar60,auVar321);
                auVar392._0_4_ = (int)auVar316._0_4_;
                auVar392._4_4_ = (int)auVar316._4_4_;
                auVar392._8_4_ = (int)auVar316._8_4_;
                auVar392._12_4_ = (int)auVar316._12_4_;
                auVar219 = vcvtdq2ps_avx(auVar392);
                auVar316 = vcmpps_avx(auVar316,auVar219,1);
                auVar316 = vandps_avx(auVar316,auVar279);
                auVar316 = vsubps_avx(auVar219,auVar316);
                auVar345._8_4_ = 0x3f317218;
                auVar345._0_8_ = 0x3f3172183f317218;
                auVar345._12_4_ = 0x3f317218;
                auVar60 = vfnmadd231ps_fma(auVar60,auVar316,auVar345);
                fVar59 = auVar60._0_4_;
                auVar393._0_4_ = fVar59 * fVar59;
                fVar356 = auVar60._4_4_;
                auVar393._4_4_ = fVar356 * fVar356;
                fVar357 = auVar60._8_4_;
                auVar393._8_4_ = fVar357 * fVar357;
                fVar358 = auVar60._12_4_;
                auVar393._12_4_ = fVar358 * fVar358;
                auVar386._8_4_ = 0x39506967;
                auVar386._0_8_ = 0x3950696739506967;
                auVar386._12_4_ = 0x39506967;
                auVar219 = vfmadd213ps_fma(auVar386,auVar60,auVar378);
                auVar61._8_4_ = 0x3c088908;
                auVar61._0_8_ = 0x3c0889083c088908;
                auVar61._12_4_ = 0x3c088908;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar61);
                auVar138._8_4_ = 0x3d2aa9c1;
                auVar138._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar138._12_4_ = 0x3d2aa9c1;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar138);
                auVar139._8_4_ = 0x3e2aaaaa;
                auVar139._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar139._12_4_ = 0x3e2aaaaa;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar139);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar321);
                auVar178._0_4_ = fVar59 + 1.0;
                auVar178._4_4_ = fVar356 + 1.0;
                auVar178._8_4_ = fVar357 + 1.0;
                auVar178._12_4_ = fVar358 + 1.0;
                auVar219 = vfmadd231ps_fma(auVar178,auVar393,auVar219);
                auVar315._0_4_ = (int)auVar316._0_4_;
                auVar315._4_4_ = (int)auVar316._4_4_;
                auVar315._8_4_ = (int)auVar316._8_4_;
                auVar315._12_4_ = (int)auVar316._12_4_;
                auVar316 = vpslld_avx(auVar315,0x17);
                auVar394._8_4_ = 0x3f800000;
                auVar394._0_8_ = 0x3f8000003f800000;
                auVar394._12_4_ = 0x3f800000;
                auVar316 = vpaddd_avx(auVar316,auVar394);
                auVar177 = vfmadd213ps_fma(auVar316,auVar219,auVar279);
                auVar179._8_4_ = 0x800000;
                auVar179._0_8_ = 0x80000000800000;
                auVar179._12_4_ = 0x800000;
                auVar316 = vmaxps_avx(auVar177,auVar179);
                auVar426._8_4_ = 0x807fffff;
                auVar426._0_8_ = 0x807fffff807fffff;
                auVar426._12_4_ = 0x807fffff;
                auVar219 = vpsrld_avx(auVar316,0x17);
                auVar316 = vandps_avx(auVar426,auVar316);
                auVar427._8_4_ = 0x3f000000;
                auVar427._0_8_ = 0x3f0000003f000000;
                auVar427._12_4_ = 0x3f000000;
                auVar60 = vorps_avx(auVar427,auVar316);
                auVar428._8_4_ = 0xffffff82;
                auVar428._0_8_ = 0xffffff82ffffff82;
                auVar428._12_4_ = 0xffffff82;
                auVar176 = vpaddd_avx(auVar428,auVar219);
                auVar255._8_4_ = 0x3f3504f3;
                auVar255._0_8_ = 0x3f3504f33f3504f3;
                auVar255._12_4_ = 0x3f3504f3;
                auVar219 = vcmpps_avx(auVar60,auVar255,1);
                auVar316 = vandps_avx(auVar219,auVar60);
                auVar180._0_4_ = auVar60._0_4_ + -1.0 + auVar316._0_4_;
                auVar180._4_4_ = auVar60._4_4_ + -1.0 + auVar316._4_4_;
                auVar180._8_4_ = auVar60._8_4_ + -1.0 + auVar316._8_4_;
                auVar180._12_4_ = auVar60._12_4_ + -1.0 + auVar316._12_4_;
                auVar60 = vcmpps_avx(auVar177,ZEXT816(0),2);
                auVar176 = vcvtdq2ps_avx(auVar176);
                auVar316 = vandps_avx(auVar219,auVar279);
                auVar316 = vsubps_avx(auVar176,auVar316);
                auVar317._8_4_ = 0x3d9021bb;
                auVar317._0_8_ = 0x3d9021bb3d9021bb;
                auVar317._12_4_ = 0x3d9021bb;
                auVar62._8_4_ = 0xbdebd1b8;
                auVar62._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar62._12_4_ = 0xbdebd1b8;
                auVar219 = vfmadd213ps_fma(auVar317,auVar180,auVar62);
                auVar63._8_4_ = 0x3def251a;
                auVar63._0_8_ = 0x3def251a3def251a;
                auVar63._12_4_ = 0x3def251a;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar63);
                auVar64._8_4_ = 0xbdfe5d4f;
                auVar64._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar64._12_4_ = 0xbdfe5d4f;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar64);
                auVar65._8_4_ = 0x3e11e9bf;
                auVar65._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar65._12_4_ = 0x3e11e9bf;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar65);
                auVar66._8_4_ = 0xbe2aae50;
                auVar66._0_8_ = 0xbe2aae50be2aae50;
                auVar66._12_4_ = 0xbe2aae50;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar66);
                auVar67._8_4_ = 0x3e4cceac;
                auVar67._0_8_ = 0x3e4cceac3e4cceac;
                auVar67._12_4_ = 0x3e4cceac;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar67);
                auVar68._8_4_ = 0xbe7ffffc;
                auVar68._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar68._12_4_ = 0xbe7ffffc;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar68);
                auVar69._8_4_ = 0x3eaaaaaa;
                auVar69._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar69._12_4_ = 0x3eaaaaaa;
                auVar219 = vfmadd213ps_fma(auVar219,auVar180,auVar69);
                auVar219 = vfmsub213ps_fma(auVar219,auVar180,auVar321);
                auVar316 = vfmadd213ps_fma(auVar316,auVar345,auVar180);
                auVar181._0_4_ = auVar180._0_4_ * auVar180._0_4_;
                auVar181._4_4_ = auVar180._4_4_ * auVar180._4_4_;
                auVar181._8_4_ = auVar180._8_4_ * auVar180._8_4_;
                auVar181._12_4_ = auVar180._12_4_ * auVar180._12_4_;
                auVar316 = vfmadd231ps_fma(auVar316,auVar181,auVar219);
                auVar182._0_4_ = auVar316._0_4_ * -2.0;
                auVar182._4_4_ = auVar316._4_4_ * -2.0;
                auVar182._8_4_ = auVar316._8_4_ * -2.0;
                auVar182._12_4_ = auVar316._12_4_ * -2.0;
                auVar70._8_4_ = 0x7fffffff;
                auVar70._0_8_ = 0x7fffffff7fffffff;
                auVar70._12_4_ = 0x7fffffff;
                auVar316 = vblendvps_avx(auVar182,auVar70,auVar60);
                auVar71._8_4_ = 0x42b0c0a5;
                auVar71._0_8_ = 0x42b0c0a542b0c0a5;
                auVar71._12_4_ = 0x42b0c0a5;
                auVar316 = vminps_avx(auVar316,auVar71);
                auVar72._8_4_ = 0xc2b0c0a5;
                auVar72._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar72._12_4_ = 0xc2b0c0a5;
                auVar60 = vmaxps_avx(auVar316,auVar72);
                auVar316 = vfmadd213ps_fma(auVar371,auVar60,auVar321);
                auVar256._0_4_ = (int)auVar316._0_4_;
                auVar256._4_4_ = (int)auVar316._4_4_;
                auVar256._8_4_ = (int)auVar316._8_4_;
                auVar256._12_4_ = (int)auVar316._12_4_;
                auVar219 = vcvtdq2ps_avx(auVar256);
                auVar316 = vcmpps_avx(auVar316,auVar219,1);
                auVar316 = vandps_avx(auVar316,auVar279);
                auVar316 = vsubps_avx(auVar219,auVar316);
                auVar60 = vfnmadd231ps_fma(auVar60,auVar316,auVar345);
                fVar59 = auVar60._0_4_;
                auVar257._0_4_ = fVar59 * fVar59;
                fVar356 = auVar60._4_4_;
                auVar257._4_4_ = fVar356 * fVar356;
                fVar357 = auVar60._8_4_;
                auVar257._8_4_ = fVar357 * fVar357;
                fVar358 = auVar60._12_4_;
                auVar257._12_4_ = fVar358 * fVar358;
                auVar219 = vfmadd213ps_fma(auVar386,auVar60,auVar378);
                auVar73._8_4_ = 0x3c088908;
                auVar73._0_8_ = 0x3c0889083c088908;
                auVar73._12_4_ = 0x3c088908;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar73);
                auVar74._8_4_ = 0x3d2aa9c1;
                auVar74._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar74._12_4_ = 0x3d2aa9c1;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar74);
                auVar377 = ZEXT864(0) << 0x20;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar139);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar321);
                auVar183._0_4_ = fVar59 + 1.0;
                auVar183._4_4_ = fVar356 + 1.0;
                auVar183._8_4_ = fVar357 + 1.0;
                auVar183._12_4_ = fVar358 + 1.0;
                auVar219 = vfmadd231ps_fma(auVar183,auVar257,auVar219);
                auVar220._0_4_ = (int)auVar316._0_4_;
                auVar220._4_4_ = (int)auVar316._4_4_;
                auVar220._8_4_ = (int)auVar316._8_4_;
                auVar220._12_4_ = (int)auVar316._12_4_;
                auVar316 = vpslld_avx(auVar220,0x17);
                auVar316 = vpaddd_avx(auVar394,auVar316);
                auVar219 = vfmadd213ps_fma(auVar316,auVar219,auVar279);
                auVar316 = vrcpps_avx(auVar219);
                auVar258._0_4_ = auVar316._0_4_ + auVar316._0_4_;
                auVar258._4_4_ = auVar316._4_4_ + auVar316._4_4_;
                auVar258._8_4_ = auVar316._8_4_ + auVar316._8_4_;
                auVar258._12_4_ = auVar316._12_4_ + auVar316._12_4_;
                auVar75._8_4_ = 0x40000000;
                auVar75._0_8_ = 0x4000000040000000;
                auVar75._12_4_ = 0x40000000;
                auVar219 = vfmsub213ps_fma(auVar219,auVar258,auVar75);
                auVar316 = vfnmadd213ps_fma(auVar219,auVar316,auVar258);
                auVar290 = vfmsub231ps_fma(auVar290,auVar290,auVar316);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar189._4_4_ = uVar1;
                auVar189._0_4_ = uVar1;
                auVar189._8_4_ = uVar1;
                auVar189._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar221._4_4_ = uVar1;
                auVar221._0_4_ = uVar1;
                auVar221._8_4_ = uVar1;
                auVar221._12_4_ = uVar1;
                auVar219 = vfmadd231ps_fma(auVar221,auVar290,auVar189);
                auVar316 = vmaxps_avx(auVar316,auVar219);
                auVar316 = vminps_avx(auVar316,auVar279);
                auVar290._0_4_ = auVar316._0_4_ * auVar290._0_4_;
                auVar290._4_4_ = auVar316._4_4_ * fVar357;
                auVar290._8_4_ = auVar316._8_4_ * fVar59;
                auVar290._12_4_ = auVar316._12_4_ * fVar356;
              }
              *pauVar45 = auVar290;
              pauVar45 = pauVar45 + 1;
              iVar52 = iVar52 + 8;
              bVar58 = iVar54 != iVar3;
              iVar54 = iVar54 + 1;
            } while (bVar58);
          }
          local_148 = local_148 + 1;
        } while (local_148 != _h);
      }
      if ((uVar2 == 4 && uVar38 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_148 = 0;
        auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar275._8_4_ = 0x3f000000;
        auVar275._0_8_ = 0x3f0000003f000000;
        auVar275._12_4_ = 0x3f000000;
        auVar280._8_4_ = 0x3f800000;
        auVar280._0_8_ = 0x3f8000003f800000;
        auVar280._12_4_ = 0x3f800000;
        auVar379._8_4_ = 0x3ab743ce;
        auVar379._0_8_ = 0x3ab743ce3ab743ce;
        auVar379._12_4_ = 0x3ab743ce;
        do {
          if (-1 < iVar3) {
            pauVar45 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_148 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar52 = 0;
            iVar54 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar295 = ZEXT816(0) << 0x40;
              }
              else {
                auVar295 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var4) + local_148 * 0x10);
              }
              if (0 < iVar32) {
                pauVar56 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * local_148 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                puVar42 = (undefined4 *)
                          ((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar52) * 4 + 4);
                uVar48 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    puVar36 = puVar42;
                    iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      uVar1 = puVar36[-3];
                      auVar291._4_4_ = uVar1;
                      auVar291._0_4_ = uVar1;
                      auVar291._8_4_ = uVar1;
                      auVar291._12_4_ = uVar1;
                      uVar1 = puVar36[-2];
                      auVar190._4_4_ = uVar1;
                      auVar190._0_4_ = uVar1;
                      auVar190._8_4_ = uVar1;
                      auVar190._12_4_ = uVar1;
                      uVar1 = puVar36[-1];
                      auVar222._4_4_ = uVar1;
                      auVar222._0_4_ = uVar1;
                      auVar222._8_4_ = uVar1;
                      auVar222._12_4_ = uVar1;
                      uVar1 = *puVar36;
                      auVar259._4_4_ = uVar1;
                      auVar259._0_4_ = uVar1;
                      auVar259._8_4_ = uVar1;
                      auVar259._12_4_ = uVar1;
                      auVar321 = vfmadd132ps_fma(auVar291,auVar295,*pauVar56);
                      auVar321 = vfmadd231ps_fma(auVar321,auVar190,pauVar56[1]);
                      auVar321 = vfmadd231ps_fma(auVar321,auVar222,pauVar56[2]);
                      auVar295 = vfmadd231ps_fma(auVar321,auVar259,pauVar56[3]);
                      pauVar56 = pauVar56 + 4;
                      puVar36 = puVar36 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar33 = iVar33 + -1;
                    } while (iVar33 != 0);
                  }
                  uVar48 = uVar48 + 1;
                  puVar42 = (undefined4 *)((long)puVar42 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar48 != uVar53);
              }
              p_Var4 = pp_Var5[-3];
              auVar321 = auVar377._0_16_;
              fVar357 = auVar295._4_4_;
              fVar59 = auVar295._8_4_;
              fVar356 = auVar295._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar295 = vmaxps_avx(auVar295,auVar321);
                break;
              case 2:
                auVar316 = vmaxps_avx(auVar295,auVar321);
                auVar321 = vminps_avx(auVar295,auVar321);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar294._4_4_ = uVar1;
                auVar294._0_4_ = uVar1;
                auVar294._8_4_ = uVar1;
                auVar294._12_4_ = uVar1;
                auVar295 = vfmadd213ps_fma(auVar294,auVar321,auVar316);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar400._4_4_ = uVar1;
                auVar400._0_4_ = uVar1;
                auVar400._8_4_ = uVar1;
                auVar400._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar435._4_4_ = uVar1;
                auVar435._0_4_ = uVar1;
                auVar435._8_4_ = uVar1;
                auVar435._12_4_ = uVar1;
                auVar321 = vmaxps_avx(auVar400,auVar295);
                auVar295 = vminps_avx(auVar435,auVar321);
                break;
              case 4:
                auVar292._0_8_ = auVar295._0_8_ ^ 0x8000000080000000;
                auVar292._8_4_ = -fVar59;
                auVar292._12_4_ = -fVar356;
                auVar197._8_4_ = 0x42b0c0a5;
                auVar197._0_8_ = 0x42b0c0a542b0c0a5;
                auVar197._12_4_ = 0x42b0c0a5;
                auVar321 = vminps_avx(auVar292,auVar197);
                auVar198._8_4_ = 0xc2b0c0a5;
                auVar198._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar198._12_4_ = 0xc2b0c0a5;
                auVar219 = vmaxps_avx(auVar321,auVar198);
                auVar401._8_4_ = 0x3fb8aa3b;
                auVar401._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar401._12_4_ = 0x3fb8aa3b;
                auVar321 = vfmadd213ps_fma(auVar401,auVar219,auVar275);
                auVar436._0_4_ = (int)auVar321._0_4_;
                auVar436._4_4_ = (int)auVar321._4_4_;
                auVar436._8_4_ = (int)auVar321._8_4_;
                auVar436._12_4_ = (int)auVar321._12_4_;
                auVar316 = vcvtdq2ps_avx(auVar436);
                auVar321 = vcmpps_avx(auVar321,auVar316,1);
                auVar321 = vandps_avx(auVar321,auVar280);
                auVar321 = vsubps_avx(auVar316,auVar321);
                auVar199._8_4_ = 0xbf317218;
                auVar199._0_8_ = 0xbf317218bf317218;
                auVar199._12_4_ = 0xbf317218;
                auVar219 = vfmadd231ps_fma(auVar219,auVar321,auVar199);
                fVar59 = auVar219._0_4_;
                auVar437._0_4_ = fVar59 * fVar59;
                fVar356 = auVar219._4_4_;
                auVar437._4_4_ = fVar356 * fVar356;
                fVar357 = auVar219._8_4_;
                auVar437._8_4_ = fVar357 * fVar357;
                fVar358 = auVar219._12_4_;
                auVar437._12_4_ = fVar358 * fVar358;
                auVar323._8_4_ = 0x39506967;
                auVar323._0_8_ = 0x3950696739506967;
                auVar323._12_4_ = 0x39506967;
                auVar200._8_4_ = 0x3ab743ce;
                auVar200._0_8_ = 0x3ab743ce3ab743ce;
                auVar200._12_4_ = 0x3ab743ce;
                auVar316 = vfmadd213ps_fma(auVar323,auVar219,auVar200);
                auVar94._8_4_ = 0x3c088908;
                auVar94._0_8_ = 0x3c0889083c088908;
                auVar94._12_4_ = 0x3c088908;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar94);
                auVar95._8_4_ = 0x3d2aa9c1;
                auVar95._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar95._12_4_ = 0x3d2aa9c1;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar95);
                auVar96._8_4_ = 0x3e2aaaaa;
                auVar96._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar96._12_4_ = 0x3e2aaaaa;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar96);
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar275);
                auVar201._0_4_ = fVar59 + 1.0;
                auVar201._4_4_ = fVar356 + 1.0;
                auVar201._8_4_ = fVar357 + 1.0;
                auVar201._12_4_ = fVar358 + 1.0;
                auVar316 = vfmadd231ps_fma(auVar201,auVar437,auVar316);
                auVar293._0_4_ = (int)auVar321._0_4_;
                auVar293._4_4_ = (int)auVar321._4_4_;
                auVar293._8_4_ = (int)auVar321._8_4_;
                auVar293._12_4_ = (int)auVar321._12_4_;
                auVar321 = vpslld_avx(auVar293,0x17);
                auVar324._8_4_ = 0x3f800000;
                auVar324._0_8_ = 0x3f8000003f800000;
                auVar324._12_4_ = 0x3f800000;
                auVar321 = vpaddd_avx(auVar324,auVar321);
                auVar316 = vfmadd213ps_fma(auVar321,auVar316,auVar280);
                auVar321 = vrcpps_avx(auVar316);
                auVar316 = vfmsub213ps_fma(auVar316,auVar321,auVar280);
                auVar295 = vfnmadd132ps_fma(auVar316,auVar321,auVar321);
                break;
              case 5:
                auVar346._8_4_ = 0x42b0c0a5;
                auVar346._0_8_ = 0x42b0c0a542b0c0a5;
                auVar346._12_4_ = 0x42b0c0a5;
                auVar321 = vminps_avx(auVar346,auVar295);
                auVar364._8_4_ = 0xc2b0c0a5;
                auVar364._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar364._12_4_ = 0xc2b0c0a5;
                auVar219 = vmaxps_avx(auVar364,auVar321);
                auVar372._8_4_ = 0x3fb8aa3b;
                auVar372._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar372._12_4_ = 0x3fb8aa3b;
                auVar321 = vfmadd213ps_fma(auVar372,auVar219,auVar275);
                auVar397._0_4_ = (int)auVar321._0_4_;
                auVar397._4_4_ = (int)auVar321._4_4_;
                auVar397._8_4_ = (int)auVar321._8_4_;
                auVar397._12_4_ = (int)auVar321._12_4_;
                auVar316 = vcvtdq2ps_avx(auVar397);
                auVar321 = vcmpps_avx(auVar321,auVar316,1);
                auVar321 = vandps_avx(auVar321,auVar280);
                auVar321 = vsubps_avx(auVar316,auVar321);
                auVar365._8_4_ = 0x3f317218;
                auVar365._0_8_ = 0x3f3172183f317218;
                auVar365._12_4_ = 0x3f317218;
                auVar219 = vfnmadd231ps_fma(auVar219,auVar321,auVar365);
                fVar59 = auVar219._0_4_;
                auVar398._0_4_ = fVar59 * fVar59;
                fVar356 = auVar219._4_4_;
                auVar398._4_4_ = fVar356 * fVar356;
                fVar357 = auVar219._8_4_;
                auVar398._8_4_ = fVar357 * fVar357;
                fVar358 = auVar219._12_4_;
                auVar398._12_4_ = fVar358 * fVar358;
                auVar387._8_4_ = 0x39506967;
                auVar387._0_8_ = 0x3950696739506967;
                auVar387._12_4_ = 0x39506967;
                auVar316 = vfmadd213ps_fma(auVar387,auVar219,auVar379);
                auVar79._8_4_ = 0x3c088908;
                auVar79._0_8_ = 0x3c0889083c088908;
                auVar79._12_4_ = 0x3c088908;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar79);
                auVar140._8_4_ = 0x3d2aa9c1;
                auVar140._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar140._12_4_ = 0x3d2aa9c1;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar140);
                auVar347._8_4_ = 0x3e2aaaaa;
                auVar347._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar347._12_4_ = 0x3e2aaaaa;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar347);
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar275);
                auVar191._0_4_ = fVar59 + 1.0;
                auVar191._4_4_ = fVar356 + 1.0;
                auVar191._8_4_ = fVar357 + 1.0;
                auVar191._12_4_ = fVar358 + 1.0;
                auVar316 = vfmadd231ps_fma(auVar191,auVar398,auVar316);
                auVar320._0_4_ = (int)auVar321._0_4_;
                auVar320._4_4_ = (int)auVar321._4_4_;
                auVar320._8_4_ = (int)auVar321._8_4_;
                auVar320._12_4_ = (int)auVar321._12_4_;
                auVar321 = vpslld_avx(auVar320,0x17);
                auVar399._8_4_ = 0x3f800000;
                auVar399._0_8_ = 0x3f8000003f800000;
                auVar399._12_4_ = 0x3f800000;
                auVar321 = vpaddd_avx(auVar321,auVar399);
                auVar176 = vfmadd213ps_fma(auVar321,auVar316,auVar280);
                auVar192._8_4_ = 0x800000;
                auVar192._0_8_ = 0x80000000800000;
                auVar192._12_4_ = 0x800000;
                auVar321 = vmaxps_avx(auVar176,auVar192);
                auVar432._8_4_ = 0x807fffff;
                auVar432._0_8_ = 0x807fffff807fffff;
                auVar432._12_4_ = 0x807fffff;
                auVar316 = vpsrld_avx(auVar321,0x17);
                auVar321 = vandps_avx(auVar432,auVar321);
                auVar433._8_4_ = 0x3f000000;
                auVar433._0_8_ = 0x3f0000003f000000;
                auVar433._12_4_ = 0x3f000000;
                auVar219 = vorps_avx(auVar433,auVar321);
                auVar434._8_4_ = 0xffffff82;
                auVar434._0_8_ = 0xffffff82ffffff82;
                auVar434._12_4_ = 0xffffff82;
                auVar60 = vpaddd_avx(auVar434,auVar316);
                auVar260._8_4_ = 0x3f3504f3;
                auVar260._0_8_ = 0x3f3504f33f3504f3;
                auVar260._12_4_ = 0x3f3504f3;
                auVar316 = vcmpps_avx(auVar219,auVar260,1);
                auVar321 = vandps_avx(auVar316,auVar219);
                auVar193._0_4_ = auVar219._0_4_ + -1.0 + auVar321._0_4_;
                auVar193._4_4_ = auVar219._4_4_ + -1.0 + auVar321._4_4_;
                auVar193._8_4_ = auVar219._8_4_ + -1.0 + auVar321._8_4_;
                auVar193._12_4_ = auVar219._12_4_ + -1.0 + auVar321._12_4_;
                auVar219 = vcmpps_avx(auVar176,ZEXT816(0),2);
                auVar60 = vcvtdq2ps_avx(auVar60);
                auVar321 = vandps_avx(auVar316,auVar280);
                auVar321 = vsubps_avx(auVar60,auVar321);
                auVar322._8_4_ = 0x3d9021bb;
                auVar322._0_8_ = 0x3d9021bb3d9021bb;
                auVar322._12_4_ = 0x3d9021bb;
                auVar80._8_4_ = 0xbdebd1b8;
                auVar80._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar80._12_4_ = 0xbdebd1b8;
                auVar316 = vfmadd213ps_fma(auVar322,auVar193,auVar80);
                auVar81._8_4_ = 0x3def251a;
                auVar81._0_8_ = 0x3def251a3def251a;
                auVar81._12_4_ = 0x3def251a;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar81);
                auVar82._8_4_ = 0xbdfe5d4f;
                auVar82._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar82._12_4_ = 0xbdfe5d4f;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar82);
                auVar83._8_4_ = 0x3e11e9bf;
                auVar83._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar83._12_4_ = 0x3e11e9bf;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar83);
                auVar84._8_4_ = 0xbe2aae50;
                auVar84._0_8_ = 0xbe2aae50be2aae50;
                auVar84._12_4_ = 0xbe2aae50;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar84);
                auVar85._8_4_ = 0x3e4cceac;
                auVar85._0_8_ = 0x3e4cceac3e4cceac;
                auVar85._12_4_ = 0x3e4cceac;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar85);
                auVar86._8_4_ = 0xbe7ffffc;
                auVar86._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar86._12_4_ = 0xbe7ffffc;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar86);
                auVar87._8_4_ = 0x3eaaaaaa;
                auVar87._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar87._12_4_ = 0x3eaaaaaa;
                auVar316 = vfmadd213ps_fma(auVar316,auVar193,auVar87);
                auVar316 = vfmsub213ps_fma(auVar316,auVar193,auVar275);
                auVar321 = vfmadd213ps_fma(auVar321,auVar365,auVar193);
                auVar194._0_4_ = auVar193._0_4_ * auVar193._0_4_;
                auVar194._4_4_ = auVar193._4_4_ * auVar193._4_4_;
                auVar194._8_4_ = auVar193._8_4_ * auVar193._8_4_;
                auVar194._12_4_ = auVar193._12_4_ * auVar193._12_4_;
                auVar321 = vfmadd231ps_fma(auVar321,auVar194,auVar316);
                auVar195._0_4_ = auVar321._0_4_ * -2.0;
                auVar195._4_4_ = auVar321._4_4_ * -2.0;
                auVar195._8_4_ = auVar321._8_4_ * -2.0;
                auVar195._12_4_ = auVar321._12_4_ * -2.0;
                auVar88._8_4_ = 0x7fffffff;
                auVar88._0_8_ = 0x7fffffff7fffffff;
                auVar88._12_4_ = 0x7fffffff;
                auVar321 = vblendvps_avx(auVar195,auVar88,auVar219);
                auVar89._8_4_ = 0x42b0c0a5;
                auVar89._0_8_ = 0x42b0c0a542b0c0a5;
                auVar89._12_4_ = 0x42b0c0a5;
                auVar321 = vminps_avx(auVar321,auVar89);
                auVar90._8_4_ = 0xc2b0c0a5;
                auVar90._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar90._12_4_ = 0xc2b0c0a5;
                auVar219 = vmaxps_avx(auVar321,auVar90);
                auVar321 = vfmadd213ps_fma(auVar372,auVar219,auVar275);
                auVar261._0_4_ = (int)auVar321._0_4_;
                auVar261._4_4_ = (int)auVar321._4_4_;
                auVar261._8_4_ = (int)auVar321._8_4_;
                auVar261._12_4_ = (int)auVar321._12_4_;
                auVar316 = vcvtdq2ps_avx(auVar261);
                auVar321 = vcmpps_avx(auVar321,auVar316,1);
                auVar321 = vandps_avx(auVar321,auVar280);
                auVar321 = vsubps_avx(auVar316,auVar321);
                auVar219 = vfnmadd231ps_fma(auVar219,auVar321,auVar365);
                fVar59 = auVar219._0_4_;
                auVar262._0_4_ = fVar59 * fVar59;
                fVar356 = auVar219._4_4_;
                auVar262._4_4_ = fVar356 * fVar356;
                fVar357 = auVar219._8_4_;
                auVar262._8_4_ = fVar357 * fVar357;
                fVar358 = auVar219._12_4_;
                auVar262._12_4_ = fVar358 * fVar358;
                auVar316 = vfmadd213ps_fma(auVar387,auVar219,auVar379);
                auVar91._8_4_ = 0x3c088908;
                auVar91._0_8_ = 0x3c0889083c088908;
                auVar91._12_4_ = 0x3c088908;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar91);
                auVar92._8_4_ = 0x3d2aa9c1;
                auVar92._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar92._12_4_ = 0x3d2aa9c1;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar92);
                auVar377 = ZEXT864(0) << 0x20;
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar347);
                auVar316 = vfmadd213ps_fma(auVar316,auVar219,auVar275);
                auVar196._0_4_ = fVar59 + 1.0;
                auVar196._4_4_ = fVar356 + 1.0;
                auVar196._8_4_ = fVar357 + 1.0;
                auVar196._12_4_ = fVar358 + 1.0;
                auVar316 = vfmadd231ps_fma(auVar196,auVar262,auVar316);
                auVar223._0_4_ = (int)auVar321._0_4_;
                auVar223._4_4_ = (int)auVar321._4_4_;
                auVar223._8_4_ = (int)auVar321._8_4_;
                auVar223._12_4_ = (int)auVar321._12_4_;
                auVar321 = vpslld_avx(auVar223,0x17);
                auVar321 = vpaddd_avx(auVar399,auVar321);
                auVar316 = vfmadd213ps_fma(auVar321,auVar316,auVar280);
                auVar321 = vrcpps_avx(auVar316);
                auVar263._0_4_ = auVar321._0_4_ + auVar321._0_4_;
                auVar263._4_4_ = auVar321._4_4_ + auVar321._4_4_;
                auVar263._8_4_ = auVar321._8_4_ + auVar321._8_4_;
                auVar263._12_4_ = auVar321._12_4_ + auVar321._12_4_;
                auVar93._8_4_ = 0x40000000;
                auVar93._0_8_ = 0x4000000040000000;
                auVar93._12_4_ = 0x40000000;
                auVar316 = vfmsub213ps_fma(auVar316,auVar263,auVar93);
                auVar321 = vfnmadd213ps_fma(auVar316,auVar321,auVar263);
                auVar295 = vfmsub231ps_fma(auVar295,auVar295,auVar321);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar202._4_4_ = uVar1;
                auVar202._0_4_ = uVar1;
                auVar202._8_4_ = uVar1;
                auVar202._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar224._4_4_ = uVar1;
                auVar224._0_4_ = uVar1;
                auVar224._8_4_ = uVar1;
                auVar224._12_4_ = uVar1;
                auVar316 = vfmadd231ps_fma(auVar224,auVar295,auVar202);
                auVar321 = vmaxps_avx(auVar316,auVar321);
                auVar321 = vminps_avx(auVar321,auVar280);
                auVar295._0_4_ = auVar321._0_4_ * auVar295._0_4_;
                auVar295._4_4_ = auVar321._4_4_ * fVar357;
                auVar295._8_4_ = auVar321._8_4_ * fVar59;
                auVar295._12_4_ = auVar321._12_4_ * fVar356;
              }
              *pauVar45 = auVar295;
              pauVar45 = pauVar45 + 1;
              iVar52 = iVar52 + 4;
              bVar58 = iVar54 != iVar3;
              iVar54 = iVar54 + 1;
            } while (bVar58);
          }
          local_148 = local_148 + 1;
        } while (local_148 != _h);
      }
      if ((uVar38 == 0 && uVar2 == 1) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        uVar48 = 0;
        auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar385 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar276._8_4_ = 0x3f800000;
        auVar276._0_8_ = 0x3f8000003f800000;
        auVar276._12_4_ = 0x3f800000;
        auVar388._8_4_ = 0x3c088908;
        auVar388._0_8_ = 0x3c0889083c088908;
        auVar388._12_4_ = 0x3c088908;
        do {
          if (-1 < iVar3) {
            pauVar45 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar48 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            iVar54 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar402 = ZEXT816(0) << 0x40;
              }
              else {
                auVar402 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar48 * 0x10);
              }
              auVar175 = ZEXT1664(auVar402);
              if (0 < iVar32) {
                pauVar56 = (undefined1 (*) [16])
                           ((this->weight_data_packed).cstep * uVar48 *
                            (this->weight_data_packed).elemsize +
                           (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                puVar42 = (undefined4 *)
                          ((long)(_func_int ***)local_b8.data +
                          (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar54) * 4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    puVar36 = puVar42;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      uVar1 = *puVar36;
                      auVar97._4_4_ = uVar1;
                      auVar97._0_4_ = uVar1;
                      auVar97._8_4_ = uVar1;
                      auVar97._12_4_ = uVar1;
                      auVar321 = vfmadd231ps_fma(auVar175._0_16_,auVar97,*pauVar56);
                      auVar175 = ZEXT1664(auVar321);
                      pauVar56 = pauVar56 + 1;
                      puVar36 = puVar36 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar402 = auVar175._0_16_;
                  uVar39 = uVar39 + 1;
                  puVar42 = (undefined4 *)((long)puVar42 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar39 != uVar53);
              }
              p_Var4 = pp_Var5[-3];
              auVar321 = auVar377._0_16_;
              auVar316 = auVar385._0_16_;
              fVar59 = auVar402._4_4_;
              fVar356 = auVar402._8_4_;
              fVar357 = auVar402._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar402 = vmaxps_avx(auVar402,auVar321);
                break;
              case 2:
                auVar316 = vmaxps_avx(auVar402,auVar321);
                auVar321 = vminps_avx(auVar402,auVar321);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar405._4_4_ = uVar1;
                auVar405._0_4_ = uVar1;
                auVar405._8_4_ = uVar1;
                auVar405._12_4_ = uVar1;
                auVar402 = vfmadd213ps_fma(auVar405,auVar321,auVar316);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar297._4_4_ = uVar1;
                auVar297._0_4_ = uVar1;
                auVar297._8_4_ = uVar1;
                auVar297._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar440._4_4_ = uVar1;
                auVar440._0_4_ = uVar1;
                auVar440._8_4_ = uVar1;
                auVar440._12_4_ = uVar1;
                auVar321 = vmaxps_avx(auVar402,auVar297);
                auVar402 = vminps_avx(auVar440,auVar321);
                break;
              case 4:
                auVar298._0_8_ = auVar402._0_8_ ^ 0x8000000080000000;
                auVar298._8_4_ = -fVar356;
                auVar298._12_4_ = -fVar357;
                auVar100._8_4_ = 0x42b0c0a5;
                auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                auVar100._12_4_ = 0x42b0c0a5;
                auVar321 = vminps_avx(auVar298,auVar100);
                auVar101._8_4_ = 0xc2b0c0a5;
                auVar101._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar101._12_4_ = 0xc2b0c0a5;
                auVar60 = vmaxps_avx(auVar321,auVar101);
                auVar403._8_4_ = 0x3fb8aa3b;
                auVar403._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar403._12_4_ = 0x3fb8aa3b;
                auVar321 = vfmadd213ps_fma(auVar403,auVar60,auVar316);
                auVar441._0_4_ = (int)auVar321._0_4_;
                auVar441._4_4_ = (int)auVar321._4_4_;
                auVar441._8_4_ = (int)auVar321._8_4_;
                auVar441._12_4_ = (int)auVar321._12_4_;
                auVar219 = vcvtdq2ps_avx(auVar441);
                auVar321 = vcmpps_avx(auVar321,auVar219,1);
                auVar321 = vandps_avx(auVar321,auVar276);
                auVar321 = vsubps_avx(auVar219,auVar321);
                auVar102._8_4_ = 0xbf317218;
                auVar102._0_8_ = 0xbf317218bf317218;
                auVar102._12_4_ = 0xbf317218;
                auVar60 = vfmadd231ps_fma(auVar60,auVar321,auVar102);
                fVar59 = auVar60._0_4_;
                auVar442._0_4_ = fVar59 * fVar59;
                fVar356 = auVar60._4_4_;
                auVar442._4_4_ = fVar356 * fVar356;
                fVar357 = auVar60._8_4_;
                auVar442._8_4_ = fVar357 * fVar357;
                fVar358 = auVar60._12_4_;
                auVar442._12_4_ = fVar358 * fVar358;
                auVar329._8_4_ = 0x39506967;
                auVar329._0_8_ = 0x3950696739506967;
                auVar329._12_4_ = 0x39506967;
                auVar103._8_4_ = 0x3ab743ce;
                auVar103._0_8_ = 0x3ab743ce3ab743ce;
                auVar103._12_4_ = 0x3ab743ce;
                auVar219 = vfmadd213ps_fma(auVar329,auVar60,auVar103);
                auVar104._8_4_ = 0x3c088908;
                auVar104._0_8_ = 0x3c0889083c088908;
                auVar104._12_4_ = 0x3c088908;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar104);
                auVar105._8_4_ = 0x3d2aa9c1;
                auVar105._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar105._12_4_ = 0x3d2aa9c1;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar105);
                auVar106._8_4_ = 0x3e2aaaaa;
                auVar106._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar106._12_4_ = 0x3e2aaaaa;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar106);
                auVar316 = vfmadd213ps_fma(auVar219,auVar60,auVar316);
                auVar299._0_4_ = fVar59 + 1.0;
                auVar299._4_4_ = fVar356 + 1.0;
                auVar299._8_4_ = fVar357 + 1.0;
                auVar299._12_4_ = fVar358 + 1.0;
                auVar316 = vfmadd231ps_fma(auVar299,auVar442,auVar316);
                auVar330._0_4_ = (int)auVar321._0_4_;
                auVar330._4_4_ = (int)auVar321._4_4_;
                auVar330._8_4_ = (int)auVar321._8_4_;
                auVar330._12_4_ = (int)auVar321._12_4_;
                auVar321 = vpslld_avx(auVar330,0x17);
                auVar404._8_4_ = 0x3f800000;
                auVar404._0_8_ = 0x3f8000003f800000;
                auVar404._12_4_ = 0x3f800000;
                auVar321 = vpaddd_avx(auVar321,auVar404);
                auVar316 = vfmadd213ps_fma(auVar321,auVar316,auVar276);
                auVar321 = vrcpps_avx(auVar316);
                auVar316 = vfmsub213ps_fma(auVar316,auVar321,auVar276);
                auVar402 = vfnmadd132ps_fma(auVar316,auVar321,auVar321);
                break;
              case 5:
                auVar348._8_4_ = 0x42b0c0a5;
                auVar348._0_8_ = 0x42b0c0a542b0c0a5;
                auVar348._12_4_ = 0x42b0c0a5;
                auVar321 = vminps_avx(auVar402,auVar348);
                auVar366._8_4_ = 0xc2b0c0a5;
                auVar366._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar366._12_4_ = 0xc2b0c0a5;
                auVar60 = vmaxps_avx(auVar366,auVar321);
                auVar373._8_4_ = 0x3fb8aa3b;
                auVar373._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar373._12_4_ = 0x3fb8aa3b;
                auVar321 = vfmadd213ps_fma(auVar373,auVar60,auVar316);
                auVar438._0_4_ = (int)auVar321._0_4_;
                auVar438._4_4_ = (int)auVar321._4_4_;
                auVar438._8_4_ = (int)auVar321._8_4_;
                auVar438._12_4_ = (int)auVar321._12_4_;
                auVar219 = vcvtdq2ps_avx(auVar438);
                auVar321 = vcmpps_avx(auVar321,auVar219,1);
                auVar321 = vandps_avx(auVar321,auVar276);
                auVar321 = vsubps_avx(auVar219,auVar321);
                auVar367._8_4_ = 0x3f317218;
                auVar367._0_8_ = 0x3f3172183f317218;
                auVar367._12_4_ = 0x3f317218;
                auVar60 = vfnmadd231ps_fma(auVar60,auVar321,auVar367);
                fVar59 = auVar60._0_4_;
                auVar439._0_4_ = fVar59 * fVar59;
                fVar356 = auVar60._4_4_;
                auVar439._4_4_ = fVar356 * fVar356;
                fVar357 = auVar60._8_4_;
                auVar439._8_4_ = fVar357 * fVar357;
                fVar358 = auVar60._12_4_;
                auVar439._12_4_ = fVar358 * fVar358;
                auVar380._8_4_ = 0x39506967;
                auVar380._0_8_ = 0x3950696739506967;
                auVar380._12_4_ = 0x39506967;
                auVar203._8_4_ = 0x3ab743ce;
                auVar203._0_8_ = 0x3ab743ce3ab743ce;
                auVar203._12_4_ = 0x3ab743ce;
                auVar219 = vfmadd213ps_fma(auVar380,auVar60,auVar203);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar388);
                auVar141._8_4_ = 0x3d2aa9c1;
                auVar141._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar141._12_4_ = 0x3d2aa9c1;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar141);
                auVar349._8_4_ = 0x3e2aaaaa;
                auVar349._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar349._12_4_ = 0x3e2aaaaa;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar349);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar316);
                auVar225._0_4_ = fVar59 + 1.0;
                auVar225._4_4_ = fVar356 + 1.0;
                auVar225._8_4_ = fVar357 + 1.0;
                auVar225._12_4_ = fVar358 + 1.0;
                auVar219 = vfmadd231ps_fma(auVar225,auVar439,auVar219);
                auVar98._0_4_ = (int)auVar321._0_4_;
                auVar98._4_4_ = (int)auVar321._4_4_;
                auVar98._8_4_ = (int)auVar321._8_4_;
                auVar98._12_4_ = (int)auVar321._12_4_;
                auVar321 = vpslld_avx(auVar98,0x17);
                auVar296._8_4_ = 0x3f800000;
                auVar296._0_8_ = 0x3f8000003f800000;
                auVar296._12_4_ = 0x3f800000;
                auVar321 = vpaddd_avx(auVar321,auVar296);
                auVar279 = vfmadd213ps_fma(auVar321,auVar219,auVar276);
                auVar226._8_4_ = 0x800000;
                auVar226._0_8_ = 0x80000000800000;
                auVar226._12_4_ = 0x800000;
                auVar321 = vmaxps_avx(auVar279,auVar226);
                auVar325._8_4_ = 0x807fffff;
                auVar325._0_8_ = 0x807fffff807fffff;
                auVar325._12_4_ = 0x807fffff;
                auVar219 = vpsrld_avx(auVar321,0x17);
                auVar321 = vandps_avx(auVar325,auVar321);
                auVar326._8_4_ = 0x3f000000;
                auVar326._0_8_ = 0x3f0000003f000000;
                auVar326._12_4_ = 0x3f000000;
                auVar60 = vorps_avx(auVar326,auVar321);
                auVar327._8_4_ = 0xffffff82;
                auVar327._0_8_ = 0xffffff82ffffff82;
                auVar327._12_4_ = 0xffffff82;
                auVar176 = vpaddd_avx(auVar219,auVar327);
                auVar264._8_4_ = 0x3f3504f3;
                auVar264._0_8_ = 0x3f3504f33f3504f3;
                auVar264._12_4_ = 0x3f3504f3;
                auVar219 = vcmpps_avx(auVar60,auVar264,1);
                auVar321 = vandps_avx(auVar219,auVar60);
                auVar227._0_4_ = auVar60._0_4_ + -1.0 + auVar321._0_4_;
                auVar227._4_4_ = auVar60._4_4_ + -1.0 + auVar321._4_4_;
                auVar227._8_4_ = auVar60._8_4_ + -1.0 + auVar321._8_4_;
                auVar227._12_4_ = auVar60._12_4_ + -1.0 + auVar321._12_4_;
                auVar60 = vcmpps_avx(auVar279,ZEXT816(0),2);
                auVar176 = vcvtdq2ps_avx(auVar176);
                auVar321 = vandps_avx(auVar219,auVar276);
                auVar321 = vsubps_avx(auVar176,auVar321);
                auVar328._8_4_ = 0x3d9021bb;
                auVar328._0_8_ = 0x3d9021bb3d9021bb;
                auVar328._12_4_ = 0x3d9021bb;
                auVar142._8_4_ = 0xbdebd1b8;
                auVar142._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar142._12_4_ = 0xbdebd1b8;
                auVar219 = vfmadd213ps_fma(auVar328,auVar227,auVar142);
                auVar143._8_4_ = 0x3def251a;
                auVar143._0_8_ = 0x3def251a3def251a;
                auVar143._12_4_ = 0x3def251a;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar143);
                auVar144._8_4_ = 0xbdfe5d4f;
                auVar144._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar144._12_4_ = 0xbdfe5d4f;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar144);
                auVar145._8_4_ = 0x3e11e9bf;
                auVar145._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar145._12_4_ = 0x3e11e9bf;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar145);
                auVar146._8_4_ = 0xbe2aae50;
                auVar146._0_8_ = 0xbe2aae50be2aae50;
                auVar146._12_4_ = 0xbe2aae50;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar146);
                auVar147._8_4_ = 0x3e4cceac;
                auVar147._0_8_ = 0x3e4cceac3e4cceac;
                auVar147._12_4_ = 0x3e4cceac;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar147);
                auVar148._8_4_ = 0xbe7ffffc;
                auVar148._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar148._12_4_ = 0xbe7ffffc;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar148);
                auVar149._8_4_ = 0x3eaaaaaa;
                auVar149._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar149._12_4_ = 0x3eaaaaaa;
                auVar219 = vfmadd213ps_fma(auVar219,auVar227,auVar149);
                auVar219 = vfmsub213ps_fma(auVar219,auVar227,auVar316);
                auVar321 = vfmadd213ps_fma(auVar321,auVar367,auVar227);
                auVar228._0_4_ = auVar227._0_4_ * auVar227._0_4_;
                auVar228._4_4_ = auVar227._4_4_ * auVar227._4_4_;
                auVar228._8_4_ = auVar227._8_4_ * auVar227._8_4_;
                auVar228._12_4_ = auVar227._12_4_ * auVar227._12_4_;
                auVar321 = vfmadd231ps_fma(auVar321,auVar228,auVar219);
                auVar229._0_4_ = auVar321._0_4_ * -2.0;
                auVar229._4_4_ = auVar321._4_4_ * -2.0;
                auVar229._8_4_ = auVar321._8_4_ * -2.0;
                auVar229._12_4_ = auVar321._12_4_ * -2.0;
                auVar150._8_4_ = 0x7fffffff;
                auVar150._0_8_ = 0x7fffffff7fffffff;
                auVar150._12_4_ = 0x7fffffff;
                auVar321 = vblendvps_avx(auVar229,auVar150,auVar60);
                auVar151._8_4_ = 0x42b0c0a5;
                auVar151._0_8_ = 0x42b0c0a542b0c0a5;
                auVar151._12_4_ = 0x42b0c0a5;
                auVar321 = vminps_avx(auVar321,auVar151);
                auVar152._8_4_ = 0xc2b0c0a5;
                auVar152._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar152._12_4_ = 0xc2b0c0a5;
                auVar60 = vmaxps_avx(auVar321,auVar152);
                auVar321 = vfmadd213ps_fma(auVar373,auVar60,auVar316);
                auVar265._0_4_ = (int)auVar321._0_4_;
                auVar265._4_4_ = (int)auVar321._4_4_;
                auVar265._8_4_ = (int)auVar321._8_4_;
                auVar265._12_4_ = (int)auVar321._12_4_;
                auVar219 = vcvtdq2ps_avx(auVar265);
                auVar321 = vcmpps_avx(auVar321,auVar219,1);
                auVar321 = vandps_avx(auVar321,auVar276);
                auVar321 = vsubps_avx(auVar219,auVar321);
                auVar60 = vfnmadd231ps_fma(auVar60,auVar321,auVar367);
                fVar59 = auVar60._0_4_;
                auVar266._0_4_ = fVar59 * fVar59;
                fVar356 = auVar60._4_4_;
                auVar266._4_4_ = fVar356 * fVar356;
                fVar357 = auVar60._8_4_;
                auVar266._8_4_ = fVar357 * fVar357;
                fVar358 = auVar60._12_4_;
                auVar266._12_4_ = fVar358 * fVar358;
                auVar153._8_4_ = 0x3ab743ce;
                auVar153._0_8_ = 0x3ab743ce3ab743ce;
                auVar153._12_4_ = 0x3ab743ce;
                auVar219 = vfmadd213ps_fma(auVar380,auVar60,auVar153);
                auVar385 = ZEXT1664(auVar316);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar388);
                auVar154._8_4_ = 0x3d2aa9c1;
                auVar154._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar154._12_4_ = 0x3d2aa9c1;
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar154);
                auVar377 = ZEXT864(0);
                auVar219 = vfmadd213ps_fma(auVar219,auVar60,auVar349);
                auVar316 = vfmadd213ps_fma(auVar219,auVar60,auVar316);
                auVar99._0_4_ = fVar59 + 1.0;
                auVar99._4_4_ = fVar356 + 1.0;
                auVar99._8_4_ = fVar357 + 1.0;
                auVar99._12_4_ = fVar358 + 1.0;
                auVar316 = vfmadd231ps_fma(auVar99,auVar266,auVar316);
                auVar230._0_4_ = (int)auVar321._0_4_;
                auVar230._4_4_ = (int)auVar321._4_4_;
                auVar230._8_4_ = (int)auVar321._8_4_;
                auVar230._12_4_ = (int)auVar321._12_4_;
                auVar321 = vpslld_avx(auVar230,0x17);
                auVar321 = vpaddd_avx(auVar321,auVar296);
                auVar316 = vfmadd213ps_fma(auVar321,auVar316,auVar276);
                auVar321 = vrcpps_avx(auVar316);
                auVar267._0_4_ = auVar321._0_4_ + auVar321._0_4_;
                auVar267._4_4_ = auVar321._4_4_ + auVar321._4_4_;
                auVar267._8_4_ = auVar321._8_4_ + auVar321._8_4_;
                auVar267._12_4_ = auVar321._12_4_ + auVar321._12_4_;
                auVar281._8_4_ = 0x40000000;
                auVar281._0_8_ = 0x4000000040000000;
                auVar281._12_4_ = 0x40000000;
                auVar316 = vfmsub213ps_fma(auVar316,auVar267,auVar281);
                auVar321 = vfnmadd213ps_fma(auVar316,auVar321,auVar267);
                auVar402 = vfmsub231ps_fma(auVar402,auVar402,auVar321);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar107._4_4_ = uVar1;
                auVar107._0_4_ = uVar1;
                auVar107._8_4_ = uVar1;
                auVar107._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar231._4_4_ = uVar1;
                auVar231._0_4_ = uVar1;
                auVar231._8_4_ = uVar1;
                auVar231._12_4_ = uVar1;
                auVar316 = vfmadd231ps_fma(auVar231,auVar402,auVar107);
                auVar321 = vmaxps_avx(auVar316,auVar321);
                auVar321 = vminps_avx(auVar321,auVar276);
                auVar402._0_4_ = auVar402._0_4_ * auVar321._0_4_;
                auVar402._4_4_ = fVar59 * auVar321._4_4_;
                auVar402._8_4_ = fVar356 * auVar321._8_4_;
                auVar402._12_4_ = fVar357 * auVar321._12_4_;
              }
              *pauVar45 = auVar402;
              pauVar45 = pauVar45 + 1;
              bVar58 = iVar54 != iVar3;
              iVar54 = iVar54 + 1;
            } while (bVar58);
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != _h);
      }
      if ((uVar2 == 4 && uVar35 == 0) && 0 < (int)_h) {
        local_60 = top_blob->data;
        local_68 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        local_58 = (ulong)_h;
        uVar48 = 0;
        do {
          pvVar31 = local_60;
          pvVar10 = local_b8.data;
          if (-1 < iVar3) {
            lVar34 = local_68 * uVar48;
            lVar57 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx2;
            sVar7 = (this->weight_data_packed).cstep;
            sVar8 = (this->weight_data_packed).elemsize;
            pvVar9 = (this->weight_data_packed).data;
            iVar54 = 0;
            uVar39 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar377 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                            uVar48 * 4));
              }
              auVar321 = auVar377._0_16_;
              if (0 < iVar32) {
                p_Var4 = pp_Var6[-3];
                pfVar40 = (float *)((long)(_func_int ***)pvVar10 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar54) * 4);
                uVar43 = 0;
                pfVar46 = (float *)(sVar7 * uVar48 * sVar8 + (long)pvVar9);
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar50 = pfVar40;
                    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      auVar108._0_4_ = *pfVar46 * *pfVar50;
                      auVar108._4_4_ = pfVar46[1] * pfVar50[1];
                      auVar108._8_4_ = pfVar46[2] * pfVar50[2];
                      auVar108._12_4_ = pfVar46[3] * pfVar50[3];
                      auVar321 = vshufpd_avx(auVar108,auVar108,1);
                      auVar109._0_4_ = auVar321._0_4_ + auVar108._0_4_;
                      auVar109._4_4_ = auVar321._4_4_ + auVar108._4_4_;
                      auVar109._8_4_ = auVar321._8_4_ + auVar108._8_4_;
                      auVar109._12_4_ = auVar321._12_4_ + auVar108._12_4_;
                      auVar321 = vmovshdup_avx(auVar109);
                      auVar377 = ZEXT464((uint)(auVar321._0_4_ + auVar377._0_4_ + auVar109._0_4_));
                      pfVar46 = pfVar46 + 4;
                      pfVar50 = pfVar50 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar321 = auVar377._0_16_;
                  uVar43 = uVar43 + 1;
                  pfVar40 = (float *)((long)pfVar40 + lVar57);
                } while (uVar43 != uVar53);
              }
              p_Var4 = pp_Var5[-3];
              fVar356 = auVar321._0_4_;
              fVar59 = fVar356;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar321 = vmaxss_avx(auVar321,ZEXT416(0));
                fVar59 = auVar321._0_4_;
                break;
              case 2:
                auVar321 = vcmpss_avx(ZEXT816(0) << 0x40,auVar321,1);
                auVar204._8_4_ = 0x3f800000;
                auVar204._0_8_ = 0x3f8000003f800000;
                auVar204._12_4_ = 0x3f800000;
                auVar321 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar204,auVar321);
                fVar59 = auVar321._0_4_ * fVar356;
                break;
              case 3:
                auVar321 = vmaxss_avx(auVar321,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar321 = vminss_avx(auVar321,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar59 = auVar321._0_4_;
                break;
              case 4:
                fVar59 = expf(-fVar356);
                fVar59 = 1.0 / (fVar59 + 1.0);
                break;
              case 5:
                local_48 = auVar321;
                fVar59 = expf(fVar356);
                fVar59 = logf(fVar59 + 1.0);
                fVar59 = tanhf(fVar59);
                fVar59 = fVar59 * (float)local_48._0_4_;
                break;
              case 6:
                fVar357 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar358 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar217 = -fVar358 / fVar357;
                fVar59 = 0.0;
                if ((fVar217 <= fVar356) && (fVar59 = fVar356, fVar356 <= fVar217 + 1.0 / fVar357))
                {
                  auVar321 = vfmadd213ss_fma(ZEXT416((uint)fVar357),auVar321,ZEXT416((uint)fVar358))
                  ;
                  fVar59 = auVar321._0_4_ * fVar356;
                }
              }
              *(float *)((long)pvVar31 + uVar39 * 4 + lVar34) = fVar59;
              uVar39 = uVar39 + 1;
              iVar54 = iVar54 + 4;
            } while (uVar39 != local_50);
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != local_58);
      }
      if ((uVar35 == 0 && uVar2 == 1) && 0 < (int)_h) {
        pvVar10 = top_blob->data;
        local_48._0_8_ = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx2;
        uVar48 = 0;
        do {
          pvVar31 = local_b8.data;
          if (-1 < iVar3) {
            lVar34 = local_48._0_8_ * uVar48;
            lVar57 = (long)local_b8.w * local_b8.elemsize;
            uVar39 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar377 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar377 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                            uVar48 * 4));
              }
              auVar321 = auVar377._0_16_;
              if (0 < iVar32) {
                iVar54 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                puVar41 = (uint *)((long)((int)uVar48 * iVar32 * iVar54) * 4 +
                                  *(long *)(&this->field_0x148 + (long)p_Var4));
                puVar44 = (uint *)((long)(_func_int ***)pvVar31 +
                                  (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)uVar39) *
                                  4);
                uVar43 = 0;
                do {
                  if (0 < iVar54) {
                    puVar51 = puVar44;
                    iVar52 = iVar54;
                    do {
                      auVar321 = vfmadd231ss_fma(auVar377._0_16_,ZEXT416(*puVar41),ZEXT416(*puVar51)
                                                );
                      auVar377 = ZEXT1664(auVar321);
                      puVar41 = puVar41 + 1;
                      puVar51 = puVar51 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar52 = iVar52 + -1;
                    } while (iVar52 != 0);
                  }
                  auVar321 = auVar377._0_16_;
                  uVar43 = uVar43 + 1;
                  puVar44 = (uint *)((long)puVar44 + lVar57);
                } while (uVar43 != uVar53);
              }
              fVar356 = auVar321._0_4_;
              fVar59 = fVar356;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar321 = vmaxss_avx(auVar321,ZEXT416(0));
                fVar59 = auVar321._0_4_;
                break;
              case 2:
                auVar321 = vcmpss_avx(ZEXT816(0) << 0x40,auVar321,1);
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar321 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar205,auVar321);
                fVar59 = auVar321._0_4_ * fVar356;
                break;
              case 3:
                auVar321 = vmaxss_avx(auVar321,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar321 = vminss_avx(auVar321,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar59 = auVar321._0_4_;
                break;
              case 4:
                fVar59 = expf(-fVar356);
                fVar59 = 1.0 / (fVar59 + 1.0);
                break;
              case 5:
                fVar59 = expf(fVar356);
                fVar59 = logf(fVar59 + 1.0);
                fVar59 = tanhf(fVar59);
                fVar59 = fVar59 * fVar356;
                break;
              case 6:
                fVar357 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar358 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar217 = -fVar358 / fVar357;
                fVar59 = 0.0;
                if ((fVar217 <= fVar356) && (fVar59 = fVar356, fVar356 <= fVar217 + 1.0 / fVar357))
                {
                  auVar321 = vfmadd213ss_fma(ZEXT416((uint)fVar357),auVar321,ZEXT416((uint)fVar358))
                  ;
                  fVar59 = auVar321._0_4_ * fVar356;
                }
              }
              *(float *)((long)pvVar10 + uVar39 * 4 + lVar34) = fVar59;
              uVar39 = uVar39 + 1;
            } while (uVar39 != local_50);
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != _h);
      }
      iVar52 = 0;
    }
  }
  piVar30 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar52;
}

Assistant:

int Convolution1D_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}